

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::sse2::CurveNiIntersector1<4>::
     intersect_t<embree::sse2::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  Vec3ff *pVVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  Primitive *pPVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Primitive PVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined6 uVar33;
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar49;
  int iVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  StackEntry *pSVar53;
  RTCRayN *extraout_RAX;
  RTCRayN *extraout_RAX_00;
  RTCRayN *pRVar54;
  int iVar55;
  RTCFilterFunctionN p_Var56;
  RTCFilterFunctionN p_Var57;
  RTCFilterFunctionN extraout_RDX;
  RTCFilterFunctionN extraout_RDX_00;
  RTCFilterFunctionN extraout_RDX_01;
  RTCFilterFunctionN extraout_RDX_02;
  RTCFilterFunctionN extraout_RDX_03;
  RTCFilterFunctionN extraout_RDX_04;
  RTCFilterFunctionN p_Var58;
  ulong uVar59;
  ulong uVar60;
  long lVar61;
  bool bVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  short sVar67;
  float fVar68;
  uint uVar69;
  float fVar115;
  float fVar117;
  __m128 a_1;
  undefined2 uVar114;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  uint uVar116;
  uint uVar118;
  uint uVar120;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  uint uVar119;
  uint uVar121;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float pp;
  float fVar122;
  undefined8 uVar123;
  float fVar143;
  float fVar144;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar145;
  float fVar159;
  float fVar160;
  vfloat4 v;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar161;
  float fVar162;
  float fVar173;
  float fVar175;
  vfloat4 v_1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar174;
  float fVar176;
  float fVar177;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar178;
  float fVar185;
  float fVar186;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar187;
  float fVar188;
  float fVar212;
  float fVar215;
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar213;
  float fVar214;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar220;
  float fVar232;
  float fVar233;
  vfloat4 a;
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar234;
  float fVar245;
  float fVar246;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar247;
  float fVar249;
  float fVar259;
  float fVar262;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar248;
  float fVar260;
  float fVar263;
  float fVar265;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar261;
  float fVar264;
  float fVar266;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar257;
  undefined1 auVar258 [16];
  float fVar267;
  float fVar268;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar279;
  float fVar280;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar281 [16];
  float fVar288;
  float fVar289;
  float fVar295;
  float fVar297;
  float fVar300;
  undefined1 auVar290 [16];
  float fVar296;
  float fVar298;
  float fVar299;
  float fVar301;
  float fVar302;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  float fVar303;
  float fVar304;
  float fVar309;
  float fVar311;
  float fVar313;
  undefined1 auVar305 [16];
  float fVar310;
  float fVar312;
  float fVar314;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  float fVar315;
  float fVar316;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 auVar317 [16];
  float fVar323;
  float fVar329;
  float fVar330;
  float fVar331;
  undefined1 auVar324 [16];
  undefined1 auVar326 [16];
  undefined1 auVar328 [16];
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float local_628;
  float fStack_624;
  float fStack_620;
  float fStack_61c;
  uint local_614;
  float local_608;
  float fStack_604;
  float fStack_600;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_5fc;
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  RTCFilterFunctionNArguments args;
  int local_50c;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_4f8;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  vfloatx vu0;
  uint local_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  undefined1 local_388 [16];
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  Primitive *local_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  BBox<embree::vfloat_impl<4>_> tp1;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  BBox<embree::vfloat_impl<4>_> tp0;
  float local_118 [4];
  undefined1 local_108 [16];
  StackEntry stack [4];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 uVar113;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar208 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar242 [16];
  undefined1 auVar325 [16];
  undefined1 auVar327 [16];
  
  PVar9 = prim[1];
  uVar59 = (ulong)(byte)PVar9;
  pPVar6 = prim + uVar59 * 0x19 + 6;
  fVar160 = *(float *)(pPVar6 + 0xc);
  fVar161 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar6) * fVar160;
  fVar173 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar6 + 4)) * fVar160;
  fVar175 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar6 + 8)) * fVar160;
  fVar145 = fVar160 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar159 = fVar160 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar160 = fVar160 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar52 = *(undefined4 *)(prim + uVar59 * 4 + 6);
  uVar113 = (undefined1)((uint)uVar52 >> 0x18);
  uVar114 = CONCAT11(uVar113,uVar113);
  uVar113 = (undefined1)((uint)uVar52 >> 0x10);
  uVar123 = CONCAT35(CONCAT21(uVar114,uVar113),CONCAT14(uVar113,uVar52));
  uVar113 = (undefined1)((uint)uVar52 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar123 >> 0x20),uVar113),uVar113);
  sVar67 = CONCAT11((char)uVar52,(char)uVar52);
  uVar60 = CONCAT62(uVar33,sVar67);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar60;
  auVar77._12_2_ = uVar114;
  auVar77._14_2_ = uVar114;
  uVar114 = (undefined2)((ulong)uVar123 >> 0x20);
  auVar252._12_4_ = auVar77._12_4_;
  auVar252._8_2_ = 0;
  auVar252._0_8_ = uVar60;
  auVar252._10_2_ = uVar114;
  auVar225._10_6_ = auVar252._10_6_;
  auVar225._8_2_ = uVar114;
  auVar225._0_8_ = uVar60;
  uVar114 = (undefined2)uVar33;
  auVar34._4_8_ = auVar225._8_8_;
  auVar34._2_2_ = uVar114;
  auVar34._0_2_ = uVar114;
  fVar122 = (float)((int)sVar67 >> 8);
  fVar143 = (float)(auVar34._0_4_ >> 0x18);
  fVar144 = (float)(auVar225._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar59 * 5 + 6);
  uVar113 = (undefined1)((uint)uVar52 >> 0x18);
  uVar114 = CONCAT11(uVar113,uVar113);
  uVar113 = (undefined1)((uint)uVar52 >> 0x10);
  uVar123 = CONCAT35(CONCAT21(uVar114,uVar113),CONCAT14(uVar113,uVar52));
  uVar113 = (undefined1)((uint)uVar52 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar123 >> 0x20),uVar113),uVar113);
  sVar67 = CONCAT11((char)uVar52,(char)uVar52);
  uVar60 = CONCAT62(uVar33,sVar67);
  auVar226._8_4_ = 0;
  auVar226._0_8_ = uVar60;
  auVar226._12_2_ = uVar114;
  auVar226._14_2_ = uVar114;
  uVar114 = (undefined2)((ulong)uVar123 >> 0x20);
  auVar254._12_4_ = auVar226._12_4_;
  auVar254._8_2_ = 0;
  auVar254._0_8_ = uVar60;
  auVar254._10_2_ = uVar114;
  auVar70._10_6_ = auVar254._10_6_;
  auVar70._8_2_ = uVar114;
  auVar70._0_8_ = uVar60;
  uVar114 = (undefined2)uVar33;
  auVar35._4_8_ = auVar70._8_8_;
  auVar35._2_2_ = uVar114;
  auVar35._0_2_ = uVar114;
  fVar178 = (float)((int)sVar67 >> 8);
  fVar185 = (float)(auVar35._0_4_ >> 0x18);
  fVar186 = (float)(auVar70._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar59 * 6 + 6);
  uVar113 = (undefined1)((uint)uVar52 >> 0x18);
  uVar114 = CONCAT11(uVar113,uVar113);
  uVar113 = (undefined1)((uint)uVar52 >> 0x10);
  uVar123 = CONCAT35(CONCAT21(uVar114,uVar113),CONCAT14(uVar113,uVar52));
  uVar113 = (undefined1)((uint)uVar52 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar123 >> 0x20),uVar113),uVar113);
  sVar67 = CONCAT11((char)uVar52,(char)uVar52);
  uVar60 = CONCAT62(uVar33,sVar67);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar60;
  auVar73._12_2_ = uVar114;
  auVar73._14_2_ = uVar114;
  uVar114 = (undefined2)((ulong)uVar123 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar60;
  auVar72._10_2_ = uVar114;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar114;
  auVar71._0_8_ = uVar60;
  uVar114 = (undefined2)uVar33;
  auVar36._4_8_ = auVar71._8_8_;
  auVar36._2_2_ = uVar114;
  auVar36._0_2_ = uVar114;
  fVar234 = (float)((int)sVar67 >> 8);
  fVar245 = (float)(auVar36._0_4_ >> 0x18);
  fVar246 = (float)(auVar71._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar59 * 0xb + 6);
  uVar113 = (undefined1)((uint)uVar52 >> 0x18);
  uVar114 = CONCAT11(uVar113,uVar113);
  uVar113 = (undefined1)((uint)uVar52 >> 0x10);
  uVar123 = CONCAT35(CONCAT21(uVar114,uVar113),CONCAT14(uVar113,uVar52));
  uVar113 = (undefined1)((uint)uVar52 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar123 >> 0x20),uVar113),uVar113);
  sVar67 = CONCAT11((char)uVar52,(char)uVar52);
  uVar60 = CONCAT62(uVar33,sVar67);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar60;
  auVar76._12_2_ = uVar114;
  auVar76._14_2_ = uVar114;
  uVar114 = (undefined2)((ulong)uVar123 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar60;
  auVar75._10_2_ = uVar114;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar114;
  auVar74._0_8_ = uVar60;
  uVar114 = (undefined2)uVar33;
  auVar37._4_8_ = auVar74._8_8_;
  auVar37._2_2_ = uVar114;
  auVar37._0_2_ = uVar114;
  fVar68 = (float)((int)sVar67 >> 8);
  fVar115 = (float)(auVar37._0_4_ >> 0x18);
  fVar117 = (float)(auVar74._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar59 * 0xc + 6);
  uVar113 = (undefined1)((uint)uVar52 >> 0x18);
  uVar114 = CONCAT11(uVar113,uVar113);
  uVar113 = (undefined1)((uint)uVar52 >> 0x10);
  uVar123 = CONCAT35(CONCAT21(uVar114,uVar113),CONCAT14(uVar113,uVar52));
  uVar113 = (undefined1)((uint)uVar52 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar123 >> 0x20),uVar113),uVar113);
  sVar67 = CONCAT11((char)uVar52,(char)uVar52);
  uVar60 = CONCAT62(uVar33,sVar67);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar60;
  auVar191._12_2_ = uVar114;
  auVar191._14_2_ = uVar114;
  uVar114 = (undefined2)((ulong)uVar123 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar60;
  auVar190._10_2_ = uVar114;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar114;
  auVar189._0_8_ = uVar60;
  uVar114 = (undefined2)uVar33;
  auVar38._4_8_ = auVar189._8_8_;
  auVar38._2_2_ = uVar114;
  auVar38._0_2_ = uVar114;
  fVar220 = (float)((int)sVar67 >> 8);
  fVar232 = (float)(auVar38._0_4_ >> 0x18);
  fVar233 = (float)(auVar189._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar59 * 0xd + 6);
  uVar113 = (undefined1)((uint)uVar52 >> 0x18);
  uVar114 = CONCAT11(uVar113,uVar113);
  uVar113 = (undefined1)((uint)uVar52 >> 0x10);
  uVar123 = CONCAT35(CONCAT21(uVar114,uVar113),CONCAT14(uVar113,uVar52));
  uVar113 = (undefined1)((uint)uVar52 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar123 >> 0x20),uVar113),uVar113);
  sVar67 = CONCAT11((char)uVar52,(char)uVar52);
  uVar60 = CONCAT62(uVar33,sVar67);
  auVar194._8_4_ = 0;
  auVar194._0_8_ = uVar60;
  auVar194._12_2_ = uVar114;
  auVar194._14_2_ = uVar114;
  uVar114 = (undefined2)((ulong)uVar123 >> 0x20);
  auVar193._12_4_ = auVar194._12_4_;
  auVar193._8_2_ = 0;
  auVar193._0_8_ = uVar60;
  auVar193._10_2_ = uVar114;
  auVar192._10_6_ = auVar193._10_6_;
  auVar192._8_2_ = uVar114;
  auVar192._0_8_ = uVar60;
  uVar114 = (undefined2)uVar33;
  auVar39._4_8_ = auVar192._8_8_;
  auVar39._2_2_ = uVar114;
  auVar39._0_2_ = uVar114;
  fVar267 = (float)((int)sVar67 >> 8);
  fVar274 = (float)(auVar39._0_4_ >> 0x18);
  fVar276 = (float)(auVar192._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar59 * 0x12 + 6);
  uVar113 = (undefined1)((uint)uVar52 >> 0x18);
  uVar114 = CONCAT11(uVar113,uVar113);
  uVar113 = (undefined1)((uint)uVar52 >> 0x10);
  uVar123 = CONCAT35(CONCAT21(uVar114,uVar113),CONCAT14(uVar113,uVar52));
  uVar113 = (undefined1)((uint)uVar52 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar123 >> 0x20),uVar113),uVar113);
  sVar67 = CONCAT11((char)uVar52,(char)uVar52);
  uVar60 = CONCAT62(uVar33,sVar67);
  auVar197._8_4_ = 0;
  auVar197._0_8_ = uVar60;
  auVar197._12_2_ = uVar114;
  auVar197._14_2_ = uVar114;
  uVar114 = (undefined2)((ulong)uVar123 >> 0x20);
  auVar196._12_4_ = auVar197._12_4_;
  auVar196._8_2_ = 0;
  auVar196._0_8_ = uVar60;
  auVar196._10_2_ = uVar114;
  auVar195._10_6_ = auVar196._10_6_;
  auVar195._8_2_ = uVar114;
  auVar195._0_8_ = uVar60;
  uVar114 = (undefined2)uVar33;
  auVar40._4_8_ = auVar195._8_8_;
  auVar40._2_2_ = uVar114;
  auVar40._0_2_ = uVar114;
  fVar247 = (float)((int)sVar67 >> 8);
  fVar259 = (float)(auVar40._0_4_ >> 0x18);
  fVar262 = (float)(auVar195._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar59 * 0x13 + 6);
  uVar113 = (undefined1)((uint)uVar52 >> 0x18);
  uVar114 = CONCAT11(uVar113,uVar113);
  uVar113 = (undefined1)((uint)uVar52 >> 0x10);
  uVar123 = CONCAT35(CONCAT21(uVar114,uVar113),CONCAT14(uVar113,uVar52));
  uVar113 = (undefined1)((uint)uVar52 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar123 >> 0x20),uVar113),uVar113);
  sVar67 = CONCAT11((char)uVar52,(char)uVar52);
  uVar60 = CONCAT62(uVar33,sVar67);
  auVar200._8_4_ = 0;
  auVar200._0_8_ = uVar60;
  auVar200._12_2_ = uVar114;
  auVar200._14_2_ = uVar114;
  uVar114 = (undefined2)((ulong)uVar123 >> 0x20);
  auVar199._12_4_ = auVar200._12_4_;
  auVar199._8_2_ = 0;
  auVar199._0_8_ = uVar60;
  auVar199._10_2_ = uVar114;
  auVar198._10_6_ = auVar199._10_6_;
  auVar198._8_2_ = uVar114;
  auVar198._0_8_ = uVar60;
  uVar114 = (undefined2)uVar33;
  auVar41._4_8_ = auVar198._8_8_;
  auVar41._2_2_ = uVar114;
  auVar41._0_2_ = uVar114;
  fVar279 = (float)((int)sVar67 >> 8);
  fVar282 = (float)(auVar41._0_4_ >> 0x18);
  fVar284 = (float)(auVar198._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar59 * 0x14 + 6);
  uVar113 = (undefined1)((uint)uVar52 >> 0x18);
  uVar114 = CONCAT11(uVar113,uVar113);
  uVar113 = (undefined1)((uint)uVar52 >> 0x10);
  uVar123 = CONCAT35(CONCAT21(uVar114,uVar113),CONCAT14(uVar113,uVar52));
  uVar113 = (undefined1)((uint)uVar52 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar123 >> 0x20),uVar113),uVar113);
  sVar67 = CONCAT11((char)uVar52,(char)uVar52);
  uVar60 = CONCAT62(uVar33,sVar67);
  auVar203._8_4_ = 0;
  auVar203._0_8_ = uVar60;
  auVar203._12_2_ = uVar114;
  auVar203._14_2_ = uVar114;
  uVar114 = (undefined2)((ulong)uVar123 >> 0x20);
  auVar202._12_4_ = auVar203._12_4_;
  auVar202._8_2_ = 0;
  auVar202._0_8_ = uVar60;
  auVar202._10_2_ = uVar114;
  auVar201._10_6_ = auVar202._10_6_;
  auVar201._8_2_ = uVar114;
  auVar201._0_8_ = uVar60;
  uVar114 = (undefined2)uVar33;
  auVar42._4_8_ = auVar201._8_8_;
  auVar42._2_2_ = uVar114;
  auVar42._0_2_ = uVar114;
  fVar315 = (float)((int)sVar67 >> 8);
  fVar318 = (float)(auVar42._0_4_ >> 0x18);
  fVar320 = (float)(auVar201._8_4_ >> 0x18);
  fVar303 = fVar145 * fVar122 + fVar159 * fVar178 + fVar160 * fVar234;
  fVar309 = fVar145 * fVar143 + fVar159 * fVar185 + fVar160 * fVar245;
  fVar311 = fVar145 * fVar144 + fVar159 * fVar186 + fVar160 * fVar246;
  fVar313 = fVar145 * (float)(auVar252._12_4_ >> 0x18) +
            fVar159 * (float)(auVar254._12_4_ >> 0x18) + fVar160 * (float)(auVar72._12_4_ >> 0x18);
  fVar288 = fVar145 * fVar68 + fVar159 * fVar220 + fVar160 * fVar267;
  fVar295 = fVar145 * fVar115 + fVar159 * fVar232 + fVar160 * fVar274;
  fVar297 = fVar145 * fVar117 + fVar159 * fVar233 + fVar160 * fVar276;
  fVar300 = fVar145 * (float)(auVar75._12_4_ >> 0x18) +
            fVar159 * (float)(auVar190._12_4_ >> 0x18) + fVar160 * (float)(auVar193._12_4_ >> 0x18);
  fVar187 = fVar145 * fVar247 + fVar159 * fVar279 + fVar160 * fVar315;
  fVar212 = fVar145 * fVar259 + fVar159 * fVar282 + fVar160 * fVar318;
  fVar215 = fVar145 * fVar262 + fVar159 * fVar284 + fVar160 * fVar320;
  fVar160 = fVar145 * (float)(auVar196._12_4_ >> 0x18) +
            fVar159 * (float)(auVar199._12_4_ >> 0x18) + fVar160 * (float)(auVar202._12_4_ >> 0x18);
  fVar178 = fVar122 * fVar161 + fVar178 * fVar173 + fVar234 * fVar175;
  fVar185 = fVar143 * fVar161 + fVar185 * fVar173 + fVar245 * fVar175;
  fVar186 = fVar144 * fVar161 + fVar186 * fVar173 + fVar246 * fVar175;
  fVar234 = (float)(auVar252._12_4_ >> 0x18) * fVar161 +
            (float)(auVar254._12_4_ >> 0x18) * fVar173 + (float)(auVar72._12_4_ >> 0x18) * fVar175;
  fVar246 = fVar68 * fVar161 + fVar220 * fVar173 + fVar267 * fVar175;
  fVar267 = fVar115 * fVar161 + fVar232 * fVar173 + fVar274 * fVar175;
  fVar274 = fVar117 * fVar161 + fVar233 * fVar173 + fVar276 * fVar175;
  fVar276 = (float)(auVar75._12_4_ >> 0x18) * fVar161 +
            (float)(auVar190._12_4_ >> 0x18) * fVar173 + (float)(auVar193._12_4_ >> 0x18) * fVar175;
  fVar220 = fVar161 * fVar247 + fVar173 * fVar279 + fVar175 * fVar315;
  fVar232 = fVar161 * fVar259 + fVar173 * fVar282 + fVar175 * fVar318;
  fVar233 = fVar161 * fVar262 + fVar173 * fVar284 + fVar175 * fVar320;
  fVar245 = fVar161 * (float)(auVar196._12_4_ >> 0x18) +
            fVar173 * (float)(auVar199._12_4_ >> 0x18) + fVar175 * (float)(auVar202._12_4_ >> 0x18);
  uVar69 = (uint)DAT_01f46710;
  uVar116 = DAT_01f46710._4_4_;
  uVar118 = DAT_01f46710._8_4_;
  uVar120 = DAT_01f46710._12_4_;
  uVar63 = -(uint)(1e-18 <= (float)((uint)fVar303 & uVar69));
  uVar64 = -(uint)(1e-18 <= (float)((uint)fVar309 & uVar116));
  uVar65 = -(uint)(1e-18 <= (float)((uint)fVar311 & uVar118));
  uVar66 = -(uint)(1e-18 <= (float)((uint)fVar313 & uVar120));
  auVar305._0_4_ = (uint)fVar303 & uVar63;
  auVar305._4_4_ = (uint)fVar309 & uVar64;
  auVar305._8_4_ = (uint)fVar311 & uVar65;
  auVar305._12_4_ = (uint)fVar313 & uVar66;
  auVar163._0_8_ = CONCAT44(~uVar64,~uVar63) & 0x219392ef219392ef;
  auVar163._8_4_ = ~uVar65 & 0x219392ef;
  auVar163._12_4_ = ~uVar66 & 0x219392ef;
  auVar163 = auVar163 | auVar305;
  uVar63 = -(uint)(1e-18 <= (float)((uint)fVar288 & uVar69));
  uVar64 = -(uint)(1e-18 <= (float)((uint)fVar295 & uVar116));
  uVar65 = -(uint)(1e-18 <= (float)((uint)fVar297 & uVar118));
  uVar66 = -(uint)(1e-18 <= (float)((uint)fVar300 & uVar120));
  auVar290._0_4_ = (uint)fVar288 & uVar63;
  auVar290._4_4_ = (uint)fVar295 & uVar64;
  auVar290._8_4_ = (uint)fVar297 & uVar65;
  auVar290._12_4_ = (uint)fVar300 & uVar66;
  auVar179._0_8_ = CONCAT44(~uVar64,~uVar63) & 0x219392ef219392ef;
  auVar179._8_4_ = ~uVar65 & 0x219392ef;
  auVar179._12_4_ = ~uVar66 & 0x219392ef;
  auVar179 = auVar179 | auVar290;
  uVar63 = -(uint)(1e-18 <= (float)((uint)fVar187 & uVar69));
  uVar64 = -(uint)(1e-18 <= (float)((uint)fVar212 & uVar116));
  uVar65 = -(uint)(1e-18 <= (float)((uint)fVar215 & uVar118));
  uVar66 = -(uint)(1e-18 <= (float)((uint)fVar160 & uVar120));
  auVar204._0_4_ = (uint)fVar187 & uVar63;
  auVar204._4_4_ = (uint)fVar212 & uVar64;
  auVar204._8_4_ = (uint)fVar215 & uVar65;
  auVar204._12_4_ = (uint)fVar160 & uVar66;
  auVar250._0_8_ = CONCAT44(~uVar64,~uVar63) & 0x219392ef219392ef;
  auVar250._8_4_ = ~uVar65 & 0x219392ef;
  auVar250._12_4_ = ~uVar66 & 0x219392ef;
  auVar250 = auVar250 | auVar204;
  auVar77 = rcpps(_DAT_01f46710,auVar163);
  fVar160 = auVar77._0_4_;
  fVar117 = auVar77._4_4_;
  fVar144 = auVar77._8_4_;
  fVar161 = auVar77._12_4_;
  fVar160 = (1.0 - auVar163._0_4_ * fVar160) * fVar160 + fVar160;
  fVar117 = (1.0 - auVar163._4_4_ * fVar117) * fVar117 + fVar117;
  fVar144 = (1.0 - auVar163._8_4_ * fVar144) * fVar144 + fVar144;
  fVar161 = (1.0 - auVar163._12_4_ * fVar161) * fVar161 + fVar161;
  auVar77 = rcpps(auVar77,auVar179);
  fVar68 = auVar77._0_4_;
  fVar122 = auVar77._4_4_;
  fVar145 = auVar77._8_4_;
  fVar173 = auVar77._12_4_;
  fVar68 = (1.0 - auVar179._0_4_ * fVar68) * fVar68 + fVar68;
  fVar122 = (1.0 - auVar179._4_4_ * fVar122) * fVar122 + fVar122;
  fVar145 = (1.0 - auVar179._8_4_ * fVar145) * fVar145 + fVar145;
  fVar173 = (1.0 - auVar179._12_4_ * fVar173) * fVar173 + fVar173;
  auVar77 = rcpps(auVar77,auVar250);
  fVar115 = auVar77._0_4_;
  fVar143 = auVar77._4_4_;
  fVar159 = auVar77._8_4_;
  fVar175 = auVar77._12_4_;
  fVar115 = (1.0 - auVar250._0_4_ * fVar115) * fVar115 + fVar115;
  fVar143 = (1.0 - auVar250._4_4_ * fVar143) * fVar143 + fVar143;
  fVar159 = (1.0 - auVar250._8_4_ * fVar159) * fVar159 + fVar159;
  fVar175 = (1.0 - auVar250._12_4_ * fVar175) * fVar175 + fVar175;
  uVar60 = *(ulong *)(prim + uVar59 * 7 + 6);
  uVar114 = (undefined2)(uVar60 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar60;
  auVar80._12_2_ = uVar114;
  auVar80._14_2_ = uVar114;
  uVar114 = (undefined2)(uVar60 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar60;
  auVar79._10_2_ = uVar114;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar114;
  auVar78._0_8_ = uVar60;
  uVar114 = (undefined2)(uVar60 >> 0x10);
  auVar43._4_8_ = auVar78._8_8_;
  auVar43._2_2_ = uVar114;
  auVar43._0_2_ = uVar114;
  auVar164._0_8_ =
       CONCAT44(((float)(auVar43._0_4_ >> 0x10) - fVar185) * fVar117,
                ((float)(int)(short)uVar60 - fVar178) * fVar160);
  auVar164._8_4_ = ((float)(auVar78._8_4_ >> 0x10) - fVar186) * fVar144;
  auVar164._12_4_ = ((float)(auVar79._12_4_ >> 0x10) - fVar234) * fVar161;
  uVar60 = *(ulong *)(prim + uVar59 * 9 + 6);
  uVar114 = (undefined2)(uVar60 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar60;
  auVar83._12_2_ = uVar114;
  auVar83._14_2_ = uVar114;
  uVar114 = (undefined2)(uVar60 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar60;
  auVar82._10_2_ = uVar114;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar114;
  auVar81._0_8_ = uVar60;
  uVar114 = (undefined2)(uVar60 >> 0x10);
  auVar44._4_8_ = auVar81._8_8_;
  auVar44._2_2_ = uVar114;
  auVar44._0_2_ = uVar114;
  auVar180._0_4_ = ((float)(int)(short)uVar60 - fVar178) * fVar160;
  auVar180._4_4_ = ((float)(auVar44._0_4_ >> 0x10) - fVar185) * fVar117;
  auVar180._8_4_ = ((float)(auVar81._8_4_ >> 0x10) - fVar186) * fVar144;
  auVar180._12_4_ = ((float)(auVar82._12_4_ >> 0x10) - fVar234) * fVar161;
  uVar60 = *(ulong *)(prim + uVar59 * 0xe + 6);
  uVar114 = (undefined2)(uVar60 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar60;
  auVar86._12_2_ = uVar114;
  auVar86._14_2_ = uVar114;
  uVar114 = (undefined2)(uVar60 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar60;
  auVar85._10_2_ = uVar114;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar114;
  auVar84._0_8_ = uVar60;
  uVar114 = (undefined2)(uVar60 >> 0x10);
  auVar45._4_8_ = auVar84._8_8_;
  auVar45._2_2_ = uVar114;
  auVar45._0_2_ = uVar114;
  auVar124._0_8_ =
       CONCAT44(((float)(auVar45._0_4_ >> 0x10) - fVar267) * fVar122,
                ((float)(int)(short)uVar60 - fVar246) * fVar68);
  auVar124._8_4_ = ((float)(auVar84._8_4_ >> 0x10) - fVar274) * fVar145;
  auVar124._12_4_ = ((float)(auVar85._12_4_ >> 0x10) - fVar276) * fVar173;
  uVar60 = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  uVar114 = (undefined2)(uVar60 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar60;
  auVar89._12_2_ = uVar114;
  auVar89._14_2_ = uVar114;
  uVar114 = (undefined2)(uVar60 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar60;
  auVar88._10_2_ = uVar114;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar114;
  auVar87._0_8_ = uVar60;
  uVar114 = (undefined2)(uVar60 >> 0x10);
  auVar46._4_8_ = auVar87._8_8_;
  auVar46._2_2_ = uVar114;
  auVar46._0_2_ = uVar114;
  auVar235._0_4_ = ((float)(int)(short)uVar60 - fVar246) * fVar68;
  auVar235._4_4_ = ((float)(auVar46._0_4_ >> 0x10) - fVar267) * fVar122;
  auVar235._8_4_ = ((float)(auVar87._8_4_ >> 0x10) - fVar274) * fVar145;
  auVar235._12_4_ = ((float)(auVar88._12_4_ >> 0x10) - fVar276) * fVar173;
  uVar60 = *(ulong *)(prim + uVar59 * 0x15 + 6);
  uVar114 = (undefined2)(uVar60 >> 0x30);
  auVar92._8_4_ = 0;
  auVar92._0_8_ = uVar60;
  auVar92._12_2_ = uVar114;
  auVar92._14_2_ = uVar114;
  uVar114 = (undefined2)(uVar60 >> 0x20);
  auVar91._12_4_ = auVar92._12_4_;
  auVar91._8_2_ = 0;
  auVar91._0_8_ = uVar60;
  auVar91._10_2_ = uVar114;
  auVar90._10_6_ = auVar91._10_6_;
  auVar90._8_2_ = uVar114;
  auVar90._0_8_ = uVar60;
  uVar114 = (undefined2)(uVar60 >> 0x10);
  auVar47._4_8_ = auVar90._8_8_;
  auVar47._2_2_ = uVar114;
  auVar47._0_2_ = uVar114;
  auVar93._0_8_ =
       CONCAT44(((float)(auVar47._0_4_ >> 0x10) - fVar232) * fVar143,
                ((float)(int)(short)uVar60 - fVar220) * fVar115);
  auVar93._8_4_ = ((float)(auVar90._8_4_ >> 0x10) - fVar233) * fVar159;
  auVar93._12_4_ = ((float)(auVar91._12_4_ >> 0x10) - fVar245) * fVar175;
  uVar60 = *(ulong *)(prim + uVar59 * 0x17 + 6);
  uVar114 = (undefined2)(uVar60 >> 0x30);
  auVar223._8_4_ = 0;
  auVar223._0_8_ = uVar60;
  auVar223._12_2_ = uVar114;
  auVar223._14_2_ = uVar114;
  uVar114 = (undefined2)(uVar60 >> 0x20);
  auVar222._12_4_ = auVar223._12_4_;
  auVar222._8_2_ = 0;
  auVar222._0_8_ = uVar60;
  auVar222._10_2_ = uVar114;
  auVar221._10_6_ = auVar222._10_6_;
  auVar221._8_2_ = uVar114;
  auVar221._0_8_ = uVar60;
  uVar114 = (undefined2)(uVar60 >> 0x10);
  auVar48._4_8_ = auVar221._8_8_;
  auVar48._2_2_ = uVar114;
  auVar48._0_2_ = uVar114;
  auVar224._0_4_ = ((float)(int)(short)uVar60 - fVar220) * fVar115;
  auVar224._4_4_ = ((float)(auVar48._0_4_ >> 0x10) - fVar232) * fVar143;
  auVar224._8_4_ = ((float)(auVar221._8_4_ >> 0x10) - fVar233) * fVar159;
  auVar224._12_4_ = ((float)(auVar222._12_4_ >> 0x10) - fVar245) * fVar175;
  auVar251._8_4_ = auVar164._8_4_;
  auVar251._0_8_ = auVar164._0_8_;
  auVar251._12_4_ = auVar164._12_4_;
  auVar252 = minps(auVar251,auVar180);
  auVar146._8_4_ = auVar124._8_4_;
  auVar146._0_8_ = auVar124._0_8_;
  auVar146._12_4_ = auVar124._12_4_;
  auVar77 = minps(auVar146,auVar235);
  auVar252 = maxps(auVar252,auVar77);
  auVar147._8_4_ = auVar93._8_4_;
  auVar147._0_8_ = auVar93._0_8_;
  auVar147._12_4_ = auVar93._12_4_;
  auVar77 = minps(auVar147,auVar224);
  uVar52 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar205._4_4_ = uVar52;
  auVar205._0_4_ = uVar52;
  auVar205._8_4_ = uVar52;
  auVar205._12_4_ = uVar52;
  auVar77 = maxps(auVar77,auVar205);
  auVar77 = maxps(auVar252,auVar77);
  fVar68 = auVar77._0_4_ * 0.99999964;
  fVar115 = auVar77._4_4_ * 0.99999964;
  fVar117 = auVar77._8_4_ * 0.99999964;
  fVar122 = auVar77._12_4_ * 0.99999964;
  auVar252 = maxps(auVar164,auVar180);
  auVar77 = maxps(auVar124,auVar235);
  auVar252 = minps(auVar252,auVar77);
  auVar77 = maxps(auVar93,auVar224);
  fVar160 = (ray->super_RayK<1>).tfar;
  auVar125._4_4_ = fVar160;
  auVar125._0_4_ = fVar160;
  auVar125._8_4_ = fVar160;
  auVar125._12_4_ = fVar160;
  auVar77 = minps(auVar77,auVar125);
  auVar77 = minps(auVar252,auVar77);
  auVar126._0_4_ = -(uint)(PVar9 != (Primitive)0x0 && fVar68 <= auVar77._0_4_ * 1.0000004);
  auVar126._4_4_ = -(uint)(1 < (byte)PVar9 && fVar115 <= auVar77._4_4_ * 1.0000004);
  auVar126._8_4_ = -(uint)(2 < (byte)PVar9 && fVar117 <= auVar77._8_4_ * 1.0000004);
  auVar126._12_4_ = -(uint)(3 < (byte)PVar9 && fVar122 <= auVar77._12_4_ * 1.0000004);
  uVar63 = movmskps((uint)(byte)PVar9,auVar126);
  auVar127._0_12_ = mm_lookupmask_ps._240_12_;
  auVar127._12_4_ = 0;
  local_320 = prim;
LAB_002f4b81:
  uVar60 = (ulong)uVar63;
  if (uVar60 == 0) {
    return;
  }
  lVar61 = 0;
  if (uVar60 != 0) {
    for (; (uVar63 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
    }
  }
  uVar60 = uVar60 - 1 & uVar60;
  uVar63 = *(uint *)(local_320 + 2);
  uVar64 = *(uint *)(local_320 + lVar61 * 4 + 6);
  pGVar10 = (context->scene->geometries).items[uVar63].ptr;
  _Var11 = pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar59 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 + _Var11 * uVar64);
  p_Var57 = pGVar10[1].intersectionFilterN;
  lVar61 = 0;
  if (uVar60 != 0) {
    for (; (uVar60 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
    }
  }
  lVar61 = *(long *)&pGVar10[1].time_range.upper;
  pfVar2 = (float *)(lVar61 + (long)p_Var57 * uVar59);
  pfVar3 = (float *)(lVar61 + (uVar59 + 1) * (long)p_Var57);
  pfVar4 = (float *)(lVar61 + (uVar59 + 2) * (long)p_Var57);
  pfVar5 = (float *)(lVar61 + (uVar59 + 3) * (long)p_Var57);
  if ((uVar60 != 0) && (uVar59 = uVar60 - 1 & uVar60, uVar59 != 0)) {
    lVar61 = 0;
    if (uVar59 != 0) {
      for (; (uVar59 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
      }
    }
    p_Var57 = (RTCFilterFunctionN)
              ((long)p_Var57 *
              (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                              _Var11 * *(uint *)(local_320 + lVar61 * 4 + 6)));
  }
  fVar160 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar143 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar144 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_348 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar145 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar159 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar161 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fVar220 = local_348 * local_348;
  fVar175 = fVar145 * fVar145;
  fVar178 = fVar159 * fVar159;
  fVar161 = fVar161 * fVar161;
  fVar173 = fVar220 + fVar175 + fVar178;
  auVar181._0_8_ = CONCAT44(fVar175 + fVar175 + fVar161,fVar173);
  auVar181._8_4_ = fVar178 + fVar175 + fVar178;
  auVar181._12_4_ = fVar161 + fVar175 + fVar161;
  auVar165._8_4_ = auVar181._8_4_;
  auVar165._0_8_ = auVar181._0_8_;
  auVar165._12_4_ = auVar181._12_4_;
  auVar77 = rcpss(auVar165,auVar181);
  fVar234 = (2.0 - fVar173 * auVar77._0_4_) * auVar77._0_4_ *
            (((pfVar2[2] + pfVar3[2]) * 0.5 - fVar144) * fVar159 +
            ((pfVar2[1] + pfVar3[1]) * 0.5 - fVar143) * fVar145 +
            ((*pfVar2 + *pfVar3) * 0.5 - fVar160) * local_348);
  local_338 = ZEXT416((uint)fVar234);
  fVar160 = local_348 * fVar234 + fVar160;
  fVar143 = fVar145 * fVar234 + fVar143;
  fVar144 = fVar159 * fVar234 + fVar144;
  fVar187 = *pfVar2 - fVar160;
  fVar212 = pfVar2[1] - fVar143;
  fVar215 = pfVar2[2] - fVar144;
  fVar246 = pfVar2[3] - 0.0;
  fVar274 = *pfVar4 - fVar160;
  fVar276 = pfVar4[1] - fVar143;
  fVar279 = pfVar4[2] - fVar144;
  fVar282 = pfVar4[3] - 0.0;
  fVar247 = *pfVar3 - fVar160;
  fVar259 = pfVar3[1] - fVar143;
  fVar262 = pfVar3[2] - fVar144;
  fVar267 = pfVar3[3] - 0.0;
  fVar160 = *pfVar5 - fVar160;
  fVar143 = pfVar5[1] - fVar143;
  fVar144 = pfVar5[2] - fVar144;
  fVar284 = pfVar5[3] - 0.0;
  local_268 = fVar187;
  fStack_264 = fVar187;
  fStack_260 = fVar187;
  fStack_25c = fVar187;
  local_278 = fVar215;
  fStack_274 = fVar215;
  fStack_270 = fVar215;
  fStack_26c = fVar215;
  local_288 = fVar247;
  fStack_284 = fVar247;
  fStack_280 = fVar247;
  fStack_27c = fVar247;
  local_298 = fVar259;
  fStack_294 = fVar259;
  fStack_290 = fVar259;
  fStack_28c = fVar259;
  local_2a8 = fVar262;
  fStack_2a4 = fVar262;
  fStack_2a0 = fVar262;
  fStack_29c = fVar262;
  local_2b8 = fVar267;
  fStack_2b4 = fVar267;
  fStack_2b0 = fVar267;
  fStack_2ac = fVar267;
  fVar232 = fVar220 + fVar178 + fVar175;
  fVar233 = fVar220 + fVar178 + fVar175;
  fVar245 = fVar220 + fVar178 + fVar175;
  fVar220 = fVar220 + fVar178 + fVar175;
  local_2c8 = fVar282;
  fStack_2c4 = fVar282;
  fStack_2c0 = fVar282;
  fStack_2bc = fVar282;
  local_2d8 = fVar143;
  fStack_2d4 = fVar143;
  fStack_2d0 = fVar143;
  fStack_2cc = fVar143;
  local_2e8 = fVar144;
  fStack_2e4 = fVar144;
  fStack_2e0 = fVar144;
  fStack_2dc = fVar144;
  local_2f8 = fVar284;
  fStack_2f4 = fVar284;
  fStack_2f0 = fVar284;
  fStack_2ec = fVar284;
  fStack_344 = local_348;
  fStack_340 = local_348;
  fStack_33c = local_348;
  local_318 = ABS(fVar232);
  fStack_314 = ABS(fVar233);
  fStack_310 = ABS(fVar245);
  fStack_30c = ABS(fVar220);
  pSVar53 = (StackEntry *)0x1;
  local_614 = 1;
  fVar161 = 0.0;
  fVar173 = 1.0;
  local_308 = fVar160;
  fStack_304 = fVar160;
  fStack_300 = fVar160;
  fStack_2fc = fVar160;
  p_Var56 = (RTCFilterFunctionN)0x0;
  fVar175 = fVar279;
  fVar178 = fVar279;
  fVar185 = fVar279;
  fVar186 = fVar279;
  local_4e8 = fVar279;
  fStack_4e4 = fVar279;
  fStack_4e0 = fVar279;
  fStack_4dc = fVar279;
  do {
    fVar162 = fVar173 - fVar161;
    fVar318 = fVar162 * 0.0 + fVar161;
    fVar174 = fVar162 * 0.33333334 + fVar161;
    fVar176 = fVar162 * 0.6666667 + fVar161;
    fVar177 = fVar162 * 1.0 + fVar161;
    fVar248 = 1.0 - fVar318;
    fVar260 = 1.0 - fVar174;
    fVar263 = 1.0 - fVar176;
    fVar265 = 1.0 - fVar177;
    fVar288 = fVar318 * 3.0;
    fVar297 = fVar174 * 3.0;
    fVar303 = fVar176 * 3.0;
    fVar311 = fVar177 * 3.0;
    fVar268 = ((fVar248 * 3.0 + -5.0) * fVar248 * fVar248 + 2.0) * 0.5;
    fVar275 = ((fVar260 * 3.0 + -5.0) * fVar260 * fVar260 + 2.0) * 0.5;
    fVar277 = ((fVar263 * 3.0 + -5.0) * fVar263 * fVar263 + 2.0) * 0.5;
    fVar278 = ((fVar265 * 3.0 + -5.0) * fVar265 * fVar265 + 2.0) * 0.5;
    fVar320 = -fVar248 * fVar318 * fVar318 * 0.5;
    fVar213 = -fVar260 * fVar174 * fVar174 * 0.5;
    fVar216 = -fVar263 * fVar176 * fVar176 * 0.5;
    fVar218 = -fVar265 * fVar177 * fVar177 * 0.5;
    fVar280 = (fVar318 * fVar318 * (fVar288 + -5.0) + 2.0) * 0.5;
    fVar283 = (fVar174 * fVar174 * (fVar297 + -5.0) + 2.0) * 0.5;
    fVar285 = (fVar176 * fVar176 * (fVar303 + -5.0) + 2.0) * 0.5;
    fVar286 = (fVar177 * fVar177 * (fVar311 + -5.0) + 2.0) * 0.5;
    fVar315 = fVar162 * 0.11111111;
    fVar188 = -fVar318 * fVar248 * fVar248 * 0.5;
    fVar214 = -fVar174 * fVar260 * fVar260 * 0.5;
    fVar217 = -fVar176 * fVar263 * fVar263 * 0.5;
    fVar219 = -fVar177 * fVar265 * fVar265 * 0.5;
    fVar332 = local_268 * fVar188 + local_288 * fVar280 + fVar274 * fVar268 + local_308 * fVar320;
    fVar335 = fStack_264 * fVar214 + fStack_284 * fVar283 + fVar274 * fVar275 + fStack_304 * fVar213
    ;
    fVar338 = fStack_260 * fVar217 + fStack_280 * fVar285 + fVar274 * fVar277 + fStack_300 * fVar216
    ;
    fVar341 = fStack_25c * fVar219 + fStack_27c * fVar286 + fVar274 * fVar278 + fStack_2fc * fVar218
    ;
    fVar295 = fVar212 * fVar188 + local_298 * fVar280 + fVar276 * fVar268 + local_2d8 * fVar320;
    fVar300 = fVar212 * fVar214 + fStack_294 * fVar283 + fVar276 * fVar275 + fStack_2d4 * fVar213;
    fVar309 = fVar212 * fVar217 + fStack_290 * fVar285 + fVar276 * fVar277 + fStack_2d0 * fVar216;
    fVar313 = fVar212 * fVar219 + fStack_28c * fVar286 + fVar276 * fVar278 + fStack_2cc * fVar218;
    fVar304 = local_278 * fVar188 + local_2a8 * fVar280 + fVar175 * fVar268 + local_2e8 * fVar320;
    fVar310 = fStack_274 * fVar214 + fStack_2a4 * fVar283 + fVar178 * fVar275 + fStack_2e4 * fVar213
    ;
    fVar312 = fStack_270 * fVar217 + fStack_2a0 * fVar285 + fVar185 * fVar277 + fStack_2e0 * fVar216
    ;
    fVar314 = fStack_26c * fVar219 + fStack_29c * fVar286 + fVar186 * fVar278 + fStack_2dc * fVar218
    ;
    fVar268 = fVar188 * fVar246 + fVar280 * local_2b8 + fVar268 * local_2c8 + fVar320 * local_2f8;
    fVar275 = fVar214 * fVar246 + fVar283 * fStack_2b4 + fVar275 * fStack_2c4 + fVar213 * fStack_2f4
    ;
    fVar277 = fVar217 * fVar246 + fVar285 * fStack_2b0 + fVar277 * fStack_2c0 + fVar216 * fStack_2f0
    ;
    fVar219 = fVar219 * fVar246 + fVar286 * fStack_2ac + fVar278 * fStack_2bc + fVar218 * fStack_2ec
    ;
    fVar216 = fVar318 * (fVar248 + fVar248);
    fVar217 = fVar174 * (fVar260 + fVar260);
    fVar218 = fVar176 * (fVar263 + fVar263);
    fVar285 = fVar177 * (fVar265 + fVar265);
    fVar278 = (fVar216 - fVar248 * fVar248) * 0.5;
    fVar280 = (fVar217 - fVar260 * fVar260) * 0.5;
    fVar283 = (fVar218 - fVar263 * fVar263) * 0.5;
    fVar286 = (fVar285 - fVar265 * fVar265) * 0.5;
    fVar320 = (fVar318 * fVar288 + (fVar318 + fVar318) * (fVar288 + -5.0)) * 0.5;
    fVar188 = (fVar174 * fVar297 + (fVar174 + fVar174) * (fVar297 + -5.0)) * 0.5;
    fVar213 = (fVar176 * fVar303 + (fVar176 + fVar176) * (fVar303 + -5.0)) * 0.5;
    fVar214 = (fVar177 * fVar311 + (fVar177 + fVar177) * (fVar311 + -5.0)) * 0.5;
    fVar175 = ((fVar288 + 2.0) * (fVar248 + fVar248) - fVar248 * 3.0 * fVar248) * 0.5;
    fVar178 = ((fVar297 + 2.0) * (fVar260 + fVar260) - fVar260 * 3.0 * fVar260) * 0.5;
    fVar185 = ((fVar303 + 2.0) * (fVar263 + fVar263) - fVar263 * 3.0 * fVar263) * 0.5;
    fVar186 = ((fVar311 + 2.0) * (fVar265 + fVar265) - fVar265 * 3.0 * fVar265) * 0.5;
    fVar288 = (fVar318 * fVar318 - fVar216) * 0.5;
    fVar297 = (fVar174 * fVar174 - fVar217) * 0.5;
    fVar303 = (fVar176 * fVar176 - fVar218) * 0.5;
    fVar311 = (fVar177 * fVar177 - fVar285) * 0.5;
    fVar216 = (local_268 * fVar278 + local_288 * fVar320 + fVar274 * fVar175 + local_308 * fVar288)
              * fVar315;
    fVar217 = (fStack_264 * fVar280 +
              fStack_284 * fVar188 + fVar274 * fVar178 + fStack_304 * fVar297) * fVar315;
    fVar218 = (fStack_260 * fVar283 +
              fStack_280 * fVar213 + fVar274 * fVar185 + fStack_300 * fVar303) * fVar315;
    fVar248 = (fStack_25c * fVar286 +
              fStack_27c * fVar214 + fVar274 * fVar186 + fStack_2fc * fVar311) * fVar315;
    fVar263 = (fVar212 * fVar278 + local_298 * fVar320 + fVar276 * fVar175 + local_2d8 * fVar288) *
              fVar315;
    fVar265 = (fVar212 * fVar280 + fStack_294 * fVar188 + fVar276 * fVar178 + fStack_2d4 * fVar297)
              * fVar315;
    fVar285 = (fVar212 * fVar283 + fStack_290 * fVar213 + fVar276 * fVar185 + fStack_2d0 * fVar303)
              * fVar315;
    fVar287 = (fVar212 * fVar286 + fStack_28c * fVar214 + fVar276 * fVar186 + fStack_2cc * fVar311)
              * fVar315;
    fVar289 = (local_278 * fVar278 + local_2a8 * fVar320 + local_4e8 * fVar175 + local_2e8 * fVar288
              ) * fVar315;
    fVar296 = (fStack_274 * fVar280 +
              fStack_2a4 * fVar188 + fStack_4e4 * fVar178 + fStack_2e4 * fVar297) * fVar315;
    fVar298 = (fStack_270 * fVar283 +
              fStack_2a0 * fVar213 + fStack_4e0 * fVar185 + fStack_2e0 * fVar303) * fVar315;
    fVar301 = (fStack_26c * fVar286 +
              fStack_29c * fVar214 + fStack_4dc * fVar186 + fStack_2dc * fVar311) * fVar315;
    fVar178 = fVar315 * (fVar280 * fVar246 +
                        fVar188 * fStack_2b4 + fVar178 * fStack_2c4 + fVar297 * fStack_2f4);
    fVar185 = fVar315 * (fVar283 * fVar246 +
                        fVar213 * fStack_2b0 + fVar185 * fStack_2c0 + fVar303 * fStack_2f0);
    fVar186 = fVar315 * (fVar286 * fVar246 +
                        fVar214 * fStack_2ac + fVar186 * fStack_2bc + fVar311 * fStack_2ec);
    auVar18._4_4_ = fVar275;
    auVar18._0_4_ = fVar268;
    auVar18._8_4_ = fVar277;
    auVar18._12_4_ = fVar219;
    auVar236._0_12_ = auVar18._4_12_;
    auVar236._12_4_ = 0;
    fVar333 = fVar268 + fVar315 * (fVar278 * fVar246 +
                                  fVar320 * local_2b8 + fVar175 * local_2c8 + fVar288 * local_2f8);
    fVar336 = fVar275 + fVar178;
    fVar339 = fVar277 + fVar185;
    fVar342 = fVar219 + fVar186;
    auVar253._0_8_ = CONCAT44(fVar277 - fVar185,fVar275 - fVar178);
    auVar253._8_4_ = fVar219 - fVar186;
    auVar253._12_4_ = 0;
    local_358._0_4_ = fVar300 - fVar295;
    local_358._4_4_ = fVar309 - fVar300;
    fStack_350 = fVar313 - fVar309;
    fStack_34c = 0.0 - fVar313;
    local_368._0_4_ = fVar310 - fVar304;
    local_368._4_4_ = fVar312 - fVar310;
    fStack_360 = fVar314 - fVar312;
    fStack_35c = 0.0 - fVar314;
    fVar188 = fVar263 * (float)local_368._0_4_ - fVar289 * (float)local_358._0_4_;
    fVar176 = fVar265 * (float)local_368._4_4_ - fVar296 * (float)local_358._4_4_;
    fVar213 = fVar285 * fStack_360 - fVar298 * fStack_350;
    fVar177 = fVar287 * fStack_35c - fVar301 * fStack_34c;
    local_378 = fVar335 - fVar332;
    fStack_374 = fVar338 - fVar335;
    fStack_370 = fVar341 - fVar338;
    fStack_36c = 0.0 - fVar341;
    fVar288 = fVar289 * local_378 - fVar216 * (float)local_368._0_4_;
    fVar303 = fVar296 * fStack_374 - fVar217 * (float)local_368._4_4_;
    fVar315 = fVar298 * fStack_370 - fVar218 * fStack_360;
    fVar320 = fVar301 * fStack_36c - fVar248 * fStack_35c;
    fVar214 = fVar216 * (float)local_358._0_4_ - fVar263 * local_378;
    fVar278 = fVar217 * (float)local_358._4_4_ - fVar265 * fStack_374;
    fVar260 = fVar218 * fStack_350 - fVar285 * fStack_370;
    fVar280 = fVar248 * fStack_34c - fVar287 * fStack_36c;
    auVar128._0_4_ = (float)local_368._0_4_ * (float)local_368._0_4_;
    auVar128._4_4_ = (float)local_368._4_4_ * (float)local_368._4_4_;
    auVar128._8_4_ = fStack_360 * fStack_360;
    auVar128._12_4_ = fStack_35c * fStack_35c;
    auVar269._0_4_ =
         local_378 * local_378 + (float)local_358._0_4_ * (float)local_358._0_4_ + auVar128._0_4_;
    auVar269._4_4_ =
         fStack_374 * fStack_374 + (float)local_358._4_4_ * (float)local_358._4_4_ + auVar128._4_4_;
    auVar269._8_4_ = fStack_370 * fStack_370 + fStack_350 * fStack_350 + auVar128._8_4_;
    auVar269._12_4_ = fStack_36c * fStack_36c + fStack_34c * fStack_34c + auVar128._12_4_;
    auVar77 = rcpps(auVar128,auVar269);
    fVar175 = auVar77._0_4_;
    fVar178 = auVar77._4_4_;
    fVar185 = auVar77._8_4_;
    fVar186 = auVar77._12_4_;
    fVar175 = (1.0 - fVar175 * auVar269._0_4_) * fVar175 + fVar175;
    fVar178 = (1.0 - fVar178 * auVar269._4_4_) * fVar178 + fVar178;
    fVar185 = (1.0 - fVar185 * auVar269._8_4_) * fVar185 + fVar185;
    fVar186 = (1.0 - fVar186 * auVar269._12_4_) * fVar186 + fVar186;
    fVar297 = (float)local_368._0_4_ * fVar265 - (float)local_358._0_4_ * fVar296;
    fVar311 = (float)local_368._4_4_ * fVar285 - (float)local_358._4_4_ * fVar298;
    fVar318 = fStack_360 * fVar287 - fStack_350 * fVar301;
    fVar174 = fStack_35c * 0.0 - fStack_34c * 0.0;
    fVar283 = local_378 * fVar296 - (float)local_368._0_4_ * fVar217;
    fVar286 = fStack_374 * fVar298 - (float)local_368._4_4_ * fVar218;
    fVar299 = fStack_370 * fVar301 - fStack_360 * fVar248;
    fVar302 = fStack_36c * 0.0 - fStack_35c * 0.0;
    fVar316 = (float)local_358._0_4_ * fVar217 - local_378 * fVar265;
    fVar319 = (float)local_358._4_4_ * fVar218 - fStack_374 * fVar285;
    fVar321 = fStack_350 * fVar248 - fStack_370 * fVar287;
    fVar322 = fStack_34c * 0.0 - fStack_36c * 0.0;
    auVar182._0_4_ = (fVar188 * fVar188 + fVar288 * fVar288 + fVar214 * fVar214) * fVar175;
    auVar182._4_4_ = (fVar176 * fVar176 + fVar303 * fVar303 + fVar278 * fVar278) * fVar178;
    auVar182._8_4_ = (fVar213 * fVar213 + fVar315 * fVar315 + fVar260 * fVar260) * fVar185;
    auVar182._12_4_ = (fVar177 * fVar177 + fVar320 * fVar320 + fVar280 * fVar280) * fVar186;
    auVar148._0_4_ = (fVar297 * fVar297 + fVar283 * fVar283 + fVar316 * fVar316) * fVar175;
    auVar148._4_4_ = (fVar311 * fVar311 + fVar286 * fVar286 + fVar319 * fVar319) * fVar178;
    auVar148._8_4_ = (fVar318 * fVar318 + fVar299 * fVar299 + fVar321 * fVar321) * fVar185;
    auVar148._12_4_ = (fVar174 * fVar174 + fVar302 * fVar302 + fVar322 * fVar322) * fVar186;
    auVar252 = maxps(auVar182,auVar148);
    auVar19._4_4_ = fVar275;
    auVar19._0_4_ = fVar268;
    auVar19._8_4_ = fVar277;
    auVar19._12_4_ = fVar219;
    auVar15._4_4_ = fVar336;
    auVar15._0_4_ = fVar333;
    auVar15._8_4_ = fVar339;
    auVar15._12_4_ = fVar342;
    auVar225 = maxps(auVar19,auVar15);
    auVar149._8_4_ = auVar253._8_4_;
    auVar149._0_8_ = auVar253._0_8_;
    auVar149._12_4_ = 0;
    auVar77 = maxps(auVar149,auVar236);
    auVar226 = maxps(auVar225,auVar77);
    auVar16._4_4_ = fVar336;
    auVar16._0_4_ = fVar333;
    auVar16._8_4_ = fVar339;
    auVar16._12_4_ = fVar342;
    auVar225 = minps(auVar19,auVar16);
    auVar254 = minps(auVar253,auVar236);
    auVar225 = minps(auVar225,auVar254);
    auVar77 = sqrtps(auVar77,auVar252);
    auVar252 = rsqrtps(auVar77,auVar269);
    fVar175 = auVar252._0_4_;
    fVar178 = auVar252._4_4_;
    fVar185 = auVar252._8_4_;
    fVar186 = auVar252._12_4_;
    auVar291._0_4_ = fVar175 * 1.5 - fVar175 * fVar175 * auVar269._0_4_ * 0.5 * fVar175;
    auVar291._4_4_ = fVar178 * 1.5 - fVar178 * fVar178 * auVar269._4_4_ * 0.5 * fVar178;
    auVar291._8_4_ = fVar185 * 1.5 - fVar185 * fVar185 * auVar269._8_4_ * 0.5 * fVar185;
    auVar291._12_4_ = fVar186 * 1.5 - fVar186 * fVar186 * auVar269._12_4_ * 0.5 * fVar186;
    fVar288 = 0.0 - fVar295;
    fVar297 = 0.0 - fVar300;
    fVar303 = 0.0 - fVar309;
    fVar311 = 0.0 - fVar313;
    fVar316 = 0.0 - fVar304;
    fVar321 = 0.0 - fVar310;
    fVar333 = 0.0 - fVar312;
    fVar339 = 0.0 - fVar314;
    fVar219 = 0.0 - fVar332;
    fVar260 = 0.0 - fVar335;
    fVar283 = 0.0 - fVar338;
    fVar299 = 0.0 - fVar341;
    fVar323 = local_348 * local_378 * auVar291._0_4_ +
              fVar145 * (float)local_358._0_4_ * auVar291._0_4_ +
              fVar159 * (float)local_368._0_4_ * auVar291._0_4_;
    fVar329 = fStack_344 * fStack_374 * auVar291._4_4_ +
              fVar145 * (float)local_358._4_4_ * auVar291._4_4_ +
              fVar159 * (float)local_368._4_4_ * auVar291._4_4_;
    fVar330 = fStack_340 * fStack_370 * auVar291._8_4_ +
              fVar145 * fStack_350 * auVar291._8_4_ + fVar159 * fStack_360 * auVar291._8_4_;
    fVar331 = fStack_33c * fStack_36c * auVar291._12_4_ +
              fVar145 * fStack_34c * auVar291._12_4_ + fVar159 * fStack_35c * auVar291._12_4_;
    fVar315 = local_378 * auVar291._0_4_ * fVar219 +
              (float)local_358._0_4_ * auVar291._0_4_ * fVar288 +
              (float)local_368._0_4_ * auVar291._0_4_ * fVar316;
    fVar318 = fStack_374 * auVar291._4_4_ * fVar260 +
              (float)local_358._4_4_ * auVar291._4_4_ * fVar297 +
              (float)local_368._4_4_ * auVar291._4_4_ * fVar321;
    fVar320 = fStack_370 * auVar291._8_4_ * fVar283 +
              fStack_350 * auVar291._8_4_ * fVar303 + fStack_360 * auVar291._8_4_ * fVar333;
    fVar174 = fStack_36c * auVar291._12_4_ * fVar299 +
              fStack_34c * auVar291._12_4_ * fVar311 + fStack_35c * auVar291._12_4_ * fVar339;
    fVar214 = (local_348 * fVar219 + fVar145 * fVar288 + fVar159 * fVar316) - fVar323 * fVar315;
    fVar268 = (fStack_344 * fVar260 + fVar145 * fVar297 + fVar159 * fVar321) - fVar329 * fVar318;
    fVar275 = (fStack_340 * fVar283 + fVar145 * fVar303 + fVar159 * fVar333) - fVar330 * fVar320;
    fVar277 = (fStack_33c * fVar299 + fVar145 * fVar311 + fVar159 * fVar339) - fVar331 * fVar174;
    fVar188 = (fVar219 * fVar219 + fVar288 * fVar288 + fVar316 * fVar316) - fVar315 * fVar315;
    fVar176 = (fVar260 * fVar260 + fVar297 * fVar297 + fVar321 * fVar321) - fVar318 * fVar318;
    fVar213 = (fVar283 * fVar283 + fVar303 * fVar303 + fVar333 * fVar333) - fVar320 * fVar320;
    fVar177 = (fVar299 * fVar299 + fVar311 * fVar311 + fVar339 * fVar339) - fVar174 * fVar174;
    fVar175 = (auVar226._0_4_ + auVar77._0_4_) * 1.0000002;
    fVar178 = (auVar226._4_4_ + auVar77._4_4_) * 1.0000002;
    fVar185 = (auVar226._8_4_ + auVar77._8_4_) * 1.0000002;
    fVar186 = (auVar226._12_4_ + auVar77._12_4_) * 1.0000002;
    auVar227._0_4_ = fVar175 * fVar175;
    auVar227._4_4_ = fVar178 * fVar178;
    auVar227._8_4_ = fVar185 * fVar185;
    auVar227._12_4_ = fVar186 * fVar186;
    fVar175 = fVar188 - auVar227._0_4_;
    fVar178 = fVar176 - auVar227._4_4_;
    fVar185 = fVar213 - auVar227._8_4_;
    fVar186 = fVar177 - auVar227._12_4_;
    fVar278 = fVar232 - fVar323 * fVar323;
    fVar280 = fVar233 - fVar329 * fVar329;
    fVar286 = fVar245 - fVar330 * fVar330;
    fVar302 = fVar220 - fVar331 * fVar331;
    fVar214 = fVar214 + fVar214;
    fVar268 = fVar268 + fVar268;
    fVar275 = fVar275 + fVar275;
    fVar277 = fVar277 + fVar277;
    fVar334 = fVar214 * fVar214 - fVar278 * 4.0 * fVar175;
    fVar337 = fVar268 * fVar268 - fVar280 * 4.0 * fVar178;
    fVar340 = fVar275 * fVar275 - fVar286 * 4.0 * fVar185;
    fVar343 = fVar277 * fVar277 - fVar302 * 4.0 * fVar186;
    auVar129._4_4_ = -(uint)(0.0 <= fVar337);
    auVar129._0_4_ = -(uint)(0.0 <= fVar334);
    auVar129._8_4_ = -(uint)(0.0 <= fVar340);
    auVar129._12_4_ = -(uint)(0.0 <= fVar343);
    uVar52 = (undefined4)((ulong)pSVar53 >> 0x20);
    iVar50 = movmskps((int)pSVar53,auVar129);
    auVar324._0_8_ = CONCAT44(fVar329 * fVar329,fVar323 * fVar323) & 0x7fffffff7fffffff;
    auVar324._8_4_ = ABS(fVar330 * fVar330);
    auVar324._12_4_ = ABS(fVar331 * fVar331);
    fVar319 = ABS(fVar278);
    fVar322 = ABS(fVar280);
    fVar336 = ABS(fVar286);
    fVar342 = ABS(fVar302);
    if (iVar50 == 0) {
      iVar50 = 0;
      auVar94 = _DAT_01f45a40;
      auVar255 = _DAT_01f45a30;
    }
    else {
      auVar17._4_4_ = fVar337;
      auVar17._0_4_ = fVar334;
      auVar17._8_4_ = fVar340;
      auVar17._12_4_ = fVar343;
      auVar226 = sqrtps(auVar291,auVar17);
      bVar62 = 0.0 <= fVar334;
      uVar65 = -(uint)bVar62;
      bVar12 = 0.0 <= fVar337;
      uVar66 = -(uint)bVar12;
      bVar13 = 0.0 <= fVar340;
      uVar69 = -(uint)bVar13;
      bVar14 = 0.0 <= fVar343;
      uVar116 = -(uint)bVar14;
      auVar150._0_4_ = fVar278 + fVar278;
      auVar150._4_4_ = fVar280 + fVar280;
      auVar150._8_4_ = fVar286 + fVar286;
      auVar150._12_4_ = fVar302 + fVar302;
      auVar252 = rcpps(auVar227,auVar150);
      fVar249 = auVar252._0_4_;
      fVar261 = auVar252._4_4_;
      fVar264 = auVar252._8_4_;
      fVar266 = auVar252._12_4_;
      fVar249 = (1.0 - auVar150._0_4_ * fVar249) * fVar249 + fVar249;
      fVar261 = (1.0 - auVar150._4_4_ * fVar261) * fVar261 + fVar261;
      fVar264 = (1.0 - auVar150._8_4_ * fVar264) * fVar264 + fVar264;
      fVar266 = (1.0 - auVar150._12_4_ * fVar266) * fVar266 + fVar266;
      fVar334 = (-fVar214 - auVar226._0_4_) * fVar249;
      fVar337 = (-fVar268 - auVar226._4_4_) * fVar261;
      fVar340 = (-fVar275 - auVar226._8_4_) * fVar264;
      fVar343 = (-fVar277 - auVar226._12_4_) * fVar266;
      fVar249 = (auVar226._0_4_ - fVar214) * fVar249;
      fVar261 = (auVar226._4_4_ - fVar268) * fVar261;
      fVar264 = (auVar226._8_4_ - fVar275) * fVar264;
      fVar266 = (auVar226._12_4_ - fVar277) * fVar266;
      local_1c8 = (fVar323 * fVar334 + fVar315) * auVar291._0_4_;
      fStack_1c4 = (fVar329 * fVar337 + fVar318) * auVar291._4_4_;
      fStack_1c0 = (fVar330 * fVar340 + fVar320) * auVar291._8_4_;
      fStack_1bc = (fVar331 * fVar343 + fVar174) * auVar291._12_4_;
      local_1b8 = (fVar323 * fVar249 + fVar315) * auVar291._0_4_;
      fStack_1b4 = (fVar329 * fVar261 + fVar318) * auVar291._4_4_;
      fStack_1b0 = (fVar330 * fVar264 + fVar320) * auVar291._8_4_;
      fStack_1ac = (fVar331 * fVar266 + fVar174) * auVar291._12_4_;
      auVar151._0_4_ = (uint)fVar334 & uVar65;
      auVar151._4_4_ = (uint)fVar337 & uVar66;
      auVar151._8_4_ = (uint)fVar340 & uVar69;
      auVar151._12_4_ = (uint)fVar343 & uVar116;
      auVar255._0_8_ = CONCAT44(~uVar66,~uVar65) & 0x7f8000007f800000;
      auVar255._8_4_ = ~uVar69 & 0x7f800000;
      auVar255._12_4_ = ~uVar116 & 0x7f800000;
      auVar255 = auVar255 | auVar151;
      auVar292._0_4_ = (uint)fVar249 & uVar65;
      auVar292._4_4_ = (uint)fVar261 & uVar66;
      auVar292._8_4_ = (uint)fVar264 & uVar69;
      auVar292._12_4_ = (uint)fVar266 & uVar116;
      auVar94._0_8_ = CONCAT44(~uVar66,~uVar65) & 0xff800000ff800000;
      auVar94._8_4_ = ~uVar69 & 0xff800000;
      auVar94._12_4_ = ~uVar116 & 0xff800000;
      auVar94 = auVar94 | auVar292;
      auVar29._4_4_ = fStack_314;
      auVar29._0_4_ = local_318;
      auVar29._8_4_ = fStack_310;
      auVar29._12_4_ = fStack_30c;
      auVar252 = maxps(auVar29,auVar324);
      fVar334 = auVar252._0_4_ * 1.9073486e-06;
      fVar337 = auVar252._4_4_ * 1.9073486e-06;
      fVar340 = auVar252._8_4_ * 1.9073486e-06;
      fVar343 = auVar252._12_4_ * 1.9073486e-06;
      auVar270._0_4_ = -(uint)(fVar319 < fVar334 && bVar62);
      auVar270._4_4_ = -(uint)(fVar322 < fVar337 && bVar12);
      auVar270._8_4_ = -(uint)(fVar336 < fVar340 && bVar13);
      auVar270._12_4_ = -(uint)(fVar342 < fVar343 && bVar14);
      iVar50 = movmskps(iVar50,auVar270);
      if (iVar50 != 0) {
        uVar65 = -(uint)(fVar175 <= 0.0);
        uVar66 = -(uint)(fVar178 <= 0.0);
        uVar69 = -(uint)(fVar185 <= 0.0);
        uVar116 = -(uint)(fVar186 <= 0.0);
        auVar158._0_4_ = (uVar65 & 0xff800000 | ~uVar65 & 0x7f800000) & auVar270._0_4_;
        auVar158._4_4_ = (uVar66 & 0xff800000 | ~uVar66 & 0x7f800000) & auVar270._4_4_;
        auVar158._8_4_ = (uVar69 & 0xff800000 | ~uVar69 & 0x7f800000) & auVar270._8_4_;
        auVar158._12_4_ = (uVar116 & 0xff800000 | ~uVar116 & 0x7f800000) & auVar270._12_4_;
        auVar294._0_4_ = ~auVar270._0_4_ & auVar255._0_4_;
        auVar294._4_4_ = ~auVar270._4_4_ & auVar255._4_4_;
        auVar294._8_4_ = ~auVar270._8_4_ & auVar255._8_4_;
        auVar294._12_4_ = ~auVar270._12_4_ & auVar255._12_4_;
        auVar244._0_4_ = (uVar65 & 0x7f800000 | ~uVar65 & 0xff800000) & auVar270._0_4_;
        auVar244._4_4_ = (uVar66 & 0x7f800000 | ~uVar66 & 0xff800000) & auVar270._4_4_;
        auVar244._8_4_ = (uVar69 & 0x7f800000 | ~uVar69 & 0xff800000) & auVar270._8_4_;
        auVar244._12_4_ = (uVar116 & 0x7f800000 | ~uVar116 & 0xff800000) & auVar270._12_4_;
        auVar272._0_4_ = ~auVar270._0_4_ & auVar94._0_4_;
        auVar272._4_4_ = ~auVar270._4_4_ & auVar94._4_4_;
        auVar272._8_4_ = ~auVar270._8_4_ & auVar94._8_4_;
        auVar272._12_4_ = ~auVar270._12_4_ & auVar94._12_4_;
        auVar129._4_4_ = -(uint)((fVar337 <= fVar322 || fVar178 <= 0.0) && bVar12);
        auVar129._0_4_ = -(uint)((fVar334 <= fVar319 || fVar175 <= 0.0) && bVar62);
        auVar129._8_4_ = -(uint)((fVar340 <= fVar336 || fVar185 <= 0.0) && bVar13);
        auVar129._12_4_ = -(uint)((fVar343 <= fVar342 || fVar186 <= 0.0) && bVar14);
        auVar94 = auVar272 | auVar244;
        auVar255 = auVar294 | auVar158;
      }
    }
    auVar130._0_4_ = (auVar129._0_4_ << 0x1f) >> 0x1f;
    auVar130._4_4_ = (auVar129._4_4_ << 0x1f) >> 0x1f;
    auVar130._8_4_ = (auVar129._8_4_ << 0x1f) >> 0x1f;
    auVar130._12_4_ = (auVar129._12_4_ << 0x1f) >> 0x1f;
    auVar130 = auVar130 & auVar127;
    iVar50 = movmskps(iVar50,auVar130);
    fVar175 = local_4e8;
    fVar178 = fStack_4e4;
    fVar185 = fStack_4e0;
    fVar186 = fStack_4dc;
    if (iVar50 == 0) {
LAB_002f5b1e:
      pRVar54 = (RTCRayN *)CONCAT44(uVar52,iVar50);
    }
    else {
      auVar228._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_338._0_4_;
      auVar228._4_4_ = auVar228._0_4_;
      auVar228._8_4_ = auVar228._0_4_;
      auVar228._12_4_ = auVar228._0_4_;
      auVar226 = maxps(auVar228,auVar255);
      auVar237._0_4_ = (ray->super_RayK<1>).tfar - (float)local_338._0_4_;
      auVar237._4_4_ = auVar237._0_4_;
      auVar237._8_4_ = auVar237._0_4_;
      auVar237._12_4_ = auVar237._0_4_;
      auVar254 = minps(auVar237,auVar94);
      auVar95._0_4_ = fVar263 * fVar145 + fVar289 * fVar159;
      auVar95._4_4_ = fVar265 * fVar145 + fVar296 * fVar159;
      auVar95._8_4_ = fVar285 * fVar145 + fVar298 * fVar159;
      auVar95._12_4_ = fVar287 * fVar145 + fVar301 * fVar159;
      auVar306._0_4_ = fVar216 * local_348 + auVar95._0_4_;
      auVar306._4_4_ = fVar217 * fStack_344 + auVar95._4_4_;
      auVar306._8_4_ = fVar218 * fStack_340 + auVar95._8_4_;
      auVar306._12_4_ = fVar248 * fStack_33c + auVar95._12_4_;
      auVar252 = rcpps(auVar95,auVar306);
      fVar334 = auVar252._0_4_;
      fVar337 = auVar252._4_4_;
      fVar340 = auVar252._8_4_;
      fVar343 = auVar252._12_4_;
      fVar288 = ((1.0 - auVar306._0_4_ * fVar334) * fVar334 + fVar334) *
                -(fVar219 * fVar216 + fVar288 * fVar263 + fVar316 * fVar289);
      fVar297 = ((1.0 - auVar306._4_4_ * fVar337) * fVar337 + fVar337) *
                -(fVar260 * fVar217 + fVar297 * fVar265 + fVar321 * fVar296);
      fVar303 = ((1.0 - auVar306._8_4_ * fVar340) * fVar340 + fVar340) *
                -(fVar283 * fVar218 + fVar303 * fVar285 + fVar333 * fVar298);
      fVar311 = ((1.0 - auVar306._12_4_ * fVar343) * fVar343 + fVar343) *
                -(fVar299 * fVar248 + fVar311 * fVar287 + fVar339 * fVar301);
      uVar65 = -(uint)(auVar306._0_4_ < 0.0 || ABS(auVar306._0_4_) < 1e-18);
      uVar66 = -(uint)(auVar306._4_4_ < 0.0 || ABS(auVar306._4_4_) < 1e-18);
      uVar69 = -(uint)(auVar306._8_4_ < 0.0 || ABS(auVar306._8_4_) < 1e-18);
      uVar116 = -(uint)(auVar306._12_4_ < 0.0 || ABS(auVar306._12_4_) < 1e-18);
      auVar183._0_8_ = CONCAT44(uVar66,uVar65) & 0xff800000ff800000;
      auVar183._8_4_ = uVar69 & 0xff800000;
      auVar183._12_4_ = uVar116 & 0xff800000;
      auVar96._0_4_ = ~uVar65 & (uint)fVar288;
      auVar96._4_4_ = ~uVar66 & (uint)fVar297;
      auVar96._8_4_ = ~uVar69 & (uint)fVar303;
      auVar96._12_4_ = ~uVar116 & (uint)fVar311;
      auVar226 = maxps(auVar226,auVar96 | auVar183);
      uVar65 = -(uint)(0.0 < auVar306._0_4_ || ABS(auVar306._0_4_) < 1e-18);
      uVar66 = -(uint)(0.0 < auVar306._4_4_ || ABS(auVar306._4_4_) < 1e-18);
      uVar69 = -(uint)(0.0 < auVar306._8_4_ || ABS(auVar306._8_4_) < 1e-18);
      uVar116 = -(uint)(0.0 < auVar306._12_4_ || ABS(auVar306._12_4_) < 1e-18);
      auVar97._0_8_ = CONCAT44(uVar66,uVar65) & 0x7f8000007f800000;
      auVar97._8_4_ = uVar69 & 0x7f800000;
      auVar97._12_4_ = uVar116 & 0x7f800000;
      auVar307._0_4_ = ~uVar65 & (uint)fVar288;
      auVar307._4_4_ = ~uVar66 & (uint)fVar297;
      auVar307._8_4_ = ~uVar69 & (uint)fVar303;
      auVar307._12_4_ = ~uVar116 & (uint)fVar311;
      auVar254 = minps(auVar254,auVar307 | auVar97);
      auVar152._0_4_ = (0.0 - fVar300) * -fVar265 + (0.0 - fVar310) * -fVar296;
      auVar152._4_4_ = (0.0 - fVar309) * -fVar285 + (0.0 - fVar312) * -fVar298;
      auVar152._8_4_ = (0.0 - fVar313) * -fVar287 + (0.0 - fVar314) * -fVar301;
      auVar152._12_4_ = 0x80000000;
      auVar131._0_4_ = -fVar217 * local_348 + -fVar265 * fVar145 + -fVar296 * fVar159;
      auVar131._4_4_ = -fVar218 * fStack_344 + -fVar285 * fVar145 + -fVar298 * fVar159;
      auVar131._8_4_ = -fVar248 * fStack_340 + -fVar287 * fVar145 + -fVar301 * fVar159;
      auVar131._12_4_ = fStack_33c * -0.0 + fVar145 * -0.0 + fVar159 * -0.0;
      auVar252 = rcpps(auVar152,auVar131);
      fVar288 = auVar252._0_4_;
      fVar297 = auVar252._4_4_;
      fVar303 = auVar252._8_4_;
      fVar311 = auVar252._12_4_;
      fVar288 = (((float)DAT_01f46a60 - auVar131._0_4_ * fVar288) * fVar288 + fVar288) *
                -((0.0 - fVar335) * -fVar217 + auVar152._0_4_);
      fVar297 = ((DAT_01f46a60._4_4_ - auVar131._4_4_ * fVar297) * fVar297 + fVar297) *
                -((0.0 - fVar338) * -fVar218 + auVar152._4_4_);
      fVar303 = ((DAT_01f46a60._8_4_ - auVar131._8_4_ * fVar303) * fVar303 + fVar303) *
                -((0.0 - fVar341) * -fVar248 + auVar152._8_4_);
      fVar311 = ((DAT_01f46a60._12_4_ - auVar131._12_4_ * fVar311) * fVar311 + fVar311) * 0.0;
      uVar65 = -(uint)(auVar131._0_4_ < 0.0 || ABS(auVar131._0_4_) < 1e-18);
      uVar66 = -(uint)(auVar131._4_4_ < 0.0 || ABS(auVar131._4_4_) < 1e-18);
      uVar69 = -(uint)(auVar131._8_4_ < 0.0 || ABS(auVar131._8_4_) < 1e-18);
      uVar116 = -(uint)(auVar131._12_4_ < 0.0 || ABS(auVar131._12_4_) < 1e-18);
      auVar153._0_8_ = CONCAT44(uVar66,uVar65) & 0xff800000ff800000;
      auVar153._8_4_ = uVar69 & 0xff800000;
      auVar153._12_4_ = uVar116 & 0xff800000;
      auVar98._0_4_ = ~uVar65 & (uint)fVar288;
      auVar98._4_4_ = ~uVar66 & (uint)fVar297;
      auVar98._8_4_ = ~uVar69 & (uint)fVar303;
      auVar98._12_4_ = ~uVar116 & (uint)fVar311;
      local_4f8 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar226,auVar98 | auVar153);
      uVar65 = -(uint)(0.0 < auVar131._0_4_ || ABS(auVar131._0_4_) < 1e-18);
      uVar66 = -(uint)(0.0 < auVar131._4_4_ || ABS(auVar131._4_4_) < 1e-18);
      uVar69 = -(uint)(0.0 < auVar131._8_4_ || ABS(auVar131._8_4_) < 1e-18);
      uVar116 = -(uint)(0.0 < auVar131._12_4_ || ABS(auVar131._12_4_) < 1e-18);
      auVar271._0_8_ = CONCAT44(uVar66,uVar65) & 0x7f8000007f800000;
      auVar271._8_4_ = uVar69 & 0x7f800000;
      auVar271._12_4_ = uVar116 & 0x7f800000;
      auVar132._0_4_ = ~uVar65 & (uint)fVar288;
      auVar132._4_4_ = ~uVar66 & (uint)fVar297;
      auVar132._8_4_ = ~uVar69 & (uint)fVar303;
      auVar132._12_4_ = ~uVar116 & (uint)fVar311;
      tp1.upper.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar254,auVar132 | auVar271);
      fVar311 = local_4f8.v[3];
      fVar288 = local_4f8.v[0];
      fVar297 = local_4f8.v[1];
      fVar303 = local_4f8.v[2];
      local_498 = auVar130._0_4_;
      uStack_494 = auVar130._4_4_;
      uStack_490 = auVar130._8_4_;
      uStack_48c = auVar130._12_4_;
      auVar99._0_4_ = -(uint)(fVar288 <= tp1.upper.field_0._0_4_) & local_498;
      auVar99._4_4_ = -(uint)(fVar297 <= tp1.upper.field_0._4_4_) & uStack_494;
      auVar99._8_4_ = -(uint)(fVar303 <= tp1.upper.field_0._8_4_) & uStack_490;
      auVar99._12_4_ = -(uint)(fVar311 <= tp1.upper.field_0._12_4_) & uStack_48c;
      iVar50 = movmskps(iVar50,auVar99);
      if (iVar50 == 0) goto LAB_002f5b1e;
      auVar20._4_4_ = (auVar225._4_4_ - auVar77._4_4_) * 0.99999976;
      auVar20._0_4_ = (auVar225._0_4_ - auVar77._0_4_) * 0.99999976;
      auVar20._8_4_ = (auVar225._8_4_ - auVar77._8_4_) * 0.99999976;
      auVar20._12_4_ = (auVar225._12_4_ - auVar77._12_4_) * 0.99999976;
      auVar252 = maxps(ZEXT816(0),auVar20);
      auVar31._4_4_ = fStack_1c4;
      auVar31._0_4_ = local_1c8;
      auVar31._8_4_ = fStack_1c0;
      auVar31._12_4_ = fStack_1bc;
      auVar77 = minps(auVar31,_DAT_01f46a60);
      auVar317._0_12_ = ZEXT812(0);
      auVar317._12_4_ = 0.0;
      auVar225 = maxps(auVar77,auVar317);
      auVar32._4_4_ = fStack_1b4;
      auVar32._0_4_ = local_1b8;
      auVar32._8_4_ = fStack_1b0;
      auVar32._12_4_ = fStack_1ac;
      auVar77 = minps(auVar32,_DAT_01f46a60);
      auVar77 = maxps(auVar77,auVar317);
      local_108._0_4_ = (auVar225._0_4_ + 0.0) * 0.25 * fVar162 + fVar161;
      local_108._4_4_ = (auVar225._4_4_ + 1.0) * 0.25 * fVar162 + fVar161;
      local_108._8_4_ = (auVar225._8_4_ + 2.0) * 0.25 * fVar162 + fVar161;
      local_108._12_4_ = (auVar225._12_4_ + 3.0) * 0.25 * fVar162 + fVar161;
      local_118[0] = (auVar77._0_4_ + 0.0) * 0.25 * fVar162 + fVar161;
      local_118[1] = (auVar77._4_4_ + 1.0) * 0.25 * fVar162 + fVar161;
      local_118[2] = (auVar77._8_4_ + 2.0) * 0.25 * fVar162 + fVar161;
      local_118[3] = (auVar77._12_4_ + 3.0) * 0.25 * fVar162 + fVar161;
      auVar154._0_4_ = fVar188 - auVar252._0_4_ * auVar252._0_4_;
      auVar154._4_4_ = fVar176 - auVar252._4_4_ * auVar252._4_4_;
      auVar154._8_4_ = fVar213 - auVar252._8_4_ * auVar252._8_4_;
      auVar154._12_4_ = fVar177 - auVar252._12_4_ * auVar252._12_4_;
      auVar133._0_4_ = fVar214 * fVar214 - fVar278 * 4.0 * auVar154._0_4_;
      auVar133._4_4_ = fVar268 * fVar268 - fVar280 * 4.0 * auVar154._4_4_;
      auVar133._8_4_ = fVar275 * fVar275 - fVar286 * 4.0 * auVar154._8_4_;
      auVar133._12_4_ = fVar277 * fVar277 - fVar302 * 4.0 * auVar154._12_4_;
      auVar166._4_4_ = -(uint)(0.0 <= auVar133._4_4_);
      auVar166._0_4_ = -(uint)(0.0 <= auVar133._0_4_);
      auVar166._8_4_ = -(uint)(0.0 <= auVar133._8_4_);
      auVar166._12_4_ = -(uint)(0.0 <= auVar133._12_4_);
      iVar50 = movmskps(iVar50,auVar166);
      if (iVar50 == 0) {
        fVar295 = 0.0;
        fVar300 = 0.0;
        fVar309 = 0.0;
        fVar313 = 0.0;
        fVar315 = 0.0;
        fVar318 = 0.0;
        fVar320 = 0.0;
        fVar174 = 0.0;
        local_628 = 0.0;
        fStack_624 = 0.0;
        fStack_620 = 0.0;
        fStack_61c = 0.0;
        _local_5d8 = ZEXT816(0);
        _local_508 = ZEXT816(0);
        iVar50 = 0;
        auVar238 = _DAT_01f45a40;
        auVar256 = _DAT_01f45a30;
      }
      else {
        auVar252 = sqrtps(local_108,auVar133);
        auVar100._0_4_ = fVar278 + fVar278;
        auVar100._4_4_ = fVar280 + fVar280;
        auVar100._8_4_ = fVar286 + fVar286;
        auVar100._12_4_ = fVar302 + fVar302;
        auVar77 = rcpps(auVar154,auVar100);
        fVar177 = auVar77._0_4_;
        fVar216 = auVar77._4_4_;
        fVar217 = auVar77._8_4_;
        fVar218 = auVar77._12_4_;
        fVar177 = ((float)DAT_01f46a60 - auVar100._0_4_ * fVar177) * fVar177 + fVar177;
        fVar216 = (DAT_01f46a60._4_4_ - auVar100._4_4_ * fVar216) * fVar216 + fVar216;
        fVar217 = (DAT_01f46a60._8_4_ - auVar100._8_4_ * fVar217) * fVar217 + fVar217;
        fVar218 = (DAT_01f46a60._12_4_ - auVar100._12_4_ * fVar218) * fVar218 + fVar218;
        fVar162 = (-fVar214 - auVar252._0_4_) * fVar177;
        fVar188 = (-fVar268 - auVar252._4_4_) * fVar216;
        fVar176 = (-fVar275 - auVar252._8_4_) * fVar217;
        fVar213 = (-fVar277 - auVar252._12_4_) * fVar218;
        fVar177 = (auVar252._0_4_ - fVar214) * fVar177;
        fVar216 = (auVar252._4_4_ - fVar268) * fVar216;
        fVar217 = (auVar252._8_4_ - fVar275) * fVar217;
        fVar218 = (auVar252._12_4_ - fVar277) * fVar218;
        fVar214 = (fVar323 * fVar162 + fVar315) * auVar291._0_4_;
        fVar268 = (fVar329 * fVar188 + fVar318) * auVar291._4_4_;
        fVar275 = (fVar330 * fVar176 + fVar320) * auVar291._8_4_;
        fVar277 = (fVar331 * fVar213 + fVar174) * auVar291._12_4_;
        local_628 = local_348 * fVar162 - (local_378 * fVar214 + fVar332);
        fStack_624 = fStack_344 * fVar188 - (fStack_374 * fVar268 + fVar335);
        fStack_620 = fStack_340 * fVar176 - (fStack_370 * fVar275 + fVar338);
        fStack_61c = fStack_33c * fVar213 - (fStack_36c * fVar277 + fVar341);
        local_5d8._4_4_ = fVar145 * fVar188 - ((float)local_358._4_4_ * fVar268 + fVar300);
        local_5d8._0_4_ = fVar145 * fVar162 - ((float)local_358._0_4_ * fVar214 + fVar295);
        fStack_5d0 = fVar145 * fVar176 - (fStack_350 * fVar275 + fVar309);
        fStack_5cc = fVar145 * fVar213 - (fStack_34c * fVar277 + fVar313);
        local_508._4_4_ = fVar159 * fVar188 - (fVar268 * (float)local_368._4_4_ + fVar310);
        local_508._0_4_ = fVar159 * fVar162 - (fVar214 * (float)local_368._0_4_ + fVar304);
        fStack_500 = fVar159 * fVar176 - (fVar275 * fStack_360 + fVar312);
        fStack_4fc = fVar159 * fVar213 - (fVar277 * fStack_35c + fVar314);
        fVar315 = (fVar323 * fVar177 + fVar315) * auVar291._0_4_;
        fVar318 = (fVar329 * fVar216 + fVar318) * auVar291._4_4_;
        fVar320 = (fVar330 * fVar217 + fVar320) * auVar291._8_4_;
        fVar174 = (fVar331 * fVar218 + fVar174) * auVar291._12_4_;
        auVar317._0_8_ =
             CONCAT44(fStack_344 * fVar216 - (fStack_374 * fVar318 + fVar335),
                      local_348 * fVar177 - (local_378 * fVar315 + fVar332));
        auVar317._8_4_ = fStack_340 * fVar217 - (fStack_370 * fVar320 + fVar338);
        auVar317._12_4_ = fStack_33c * fVar218 - (fStack_36c * fVar174 + fVar341);
        fVar295 = fVar145 * fVar177 - ((float)local_358._0_4_ * fVar315 + fVar295);
        fVar300 = fVar145 * fVar216 - ((float)local_358._4_4_ * fVar318 + fVar300);
        fVar309 = fVar145 * fVar217 - (fStack_350 * fVar320 + fVar309);
        fVar313 = fVar145 * fVar218 - (fStack_34c * fVar174 + fVar313);
        bVar62 = 0.0 <= auVar133._0_4_;
        uVar65 = -(uint)bVar62;
        bVar12 = 0.0 <= auVar133._4_4_;
        uVar66 = -(uint)bVar12;
        bVar13 = 0.0 <= auVar133._8_4_;
        uVar69 = -(uint)bVar13;
        bVar14 = 0.0 <= auVar133._12_4_;
        uVar116 = -(uint)bVar14;
        fVar315 = fVar159 * fVar177 - (fVar315 * (float)local_368._0_4_ + fVar304);
        fVar318 = fVar159 * fVar216 - (fVar318 * (float)local_368._4_4_ + fVar310);
        fVar320 = fVar159 * fVar217 - (fVar320 * fStack_360 + fVar312);
        fVar174 = fVar159 * fVar218 - (fVar174 * fStack_35c + fVar314);
        auVar101._0_4_ = (uint)fVar162 & uVar65;
        auVar101._4_4_ = (uint)fVar188 & uVar66;
        auVar101._8_4_ = (uint)fVar176 & uVar69;
        auVar101._12_4_ = (uint)fVar213 & uVar116;
        auVar256._0_8_ = CONCAT44(~uVar66,~uVar65) & 0x7f8000007f800000;
        auVar256._8_4_ = ~uVar69 & 0x7f800000;
        auVar256._12_4_ = ~uVar116 & 0x7f800000;
        auVar256 = auVar256 | auVar101;
        auVar229._0_4_ = (uint)fVar177 & uVar65;
        auVar229._4_4_ = (uint)fVar216 & uVar66;
        auVar229._8_4_ = (uint)fVar217 & uVar69;
        auVar229._12_4_ = (uint)fVar218 & uVar116;
        auVar238._0_8_ = CONCAT44(~uVar66,~uVar65) & 0xff800000ff800000;
        auVar238._8_4_ = ~uVar69 & 0xff800000;
        auVar238._12_4_ = ~uVar116 & 0xff800000;
        auVar238 = auVar238 | auVar229;
        auVar30._4_4_ = fStack_314;
        auVar30._0_4_ = local_318;
        auVar30._8_4_ = fStack_310;
        auVar30._12_4_ = fStack_30c;
        auVar77 = maxps(auVar30,auVar324);
        fVar162 = auVar77._0_4_ * 1.9073486e-06;
        fVar188 = auVar77._4_4_ * 1.9073486e-06;
        fVar176 = auVar77._8_4_ * 1.9073486e-06;
        fVar213 = auVar77._12_4_ * 1.9073486e-06;
        auVar230._0_4_ = -(uint)(fVar319 < fVar162 && bVar62);
        auVar230._4_4_ = -(uint)(fVar322 < fVar188 && bVar12);
        auVar230._8_4_ = -(uint)(fVar336 < fVar176 && bVar13);
        auVar230._12_4_ = -(uint)(fVar342 < fVar213 && bVar14);
        iVar50 = movmskps(iVar50,auVar230);
        if (iVar50 != 0) {
          uVar65 = -(uint)(auVar154._0_4_ <= 0.0);
          uVar66 = -(uint)(auVar154._4_4_ <= 0.0);
          uVar69 = -(uint)(auVar154._8_4_ <= 0.0);
          uVar116 = -(uint)(auVar154._12_4_ <= 0.0);
          auVar273._0_4_ = (uVar65 & 0xff800000 | ~uVar65 & 0x7f800000) & auVar230._0_4_;
          auVar273._4_4_ = (uVar66 & 0xff800000 | ~uVar66 & 0x7f800000) & auVar230._4_4_;
          auVar273._8_4_ = (uVar69 & 0xff800000 | ~uVar69 & 0x7f800000) & auVar230._8_4_;
          auVar273._12_4_ = (uVar116 & 0xff800000 | ~uVar116 & 0x7f800000) & auVar230._12_4_;
          auVar281._0_4_ = ~auVar230._0_4_ & auVar256._0_4_;
          auVar281._4_4_ = ~auVar230._4_4_ & auVar256._4_4_;
          auVar281._8_4_ = ~auVar230._8_4_ & auVar256._8_4_;
          auVar281._12_4_ = ~auVar230._12_4_ & auVar256._12_4_;
          auVar258._0_4_ = (uVar65 & 0x7f800000 | ~uVar65 & 0xff800000) & auVar230._0_4_;
          auVar258._4_4_ = (uVar66 & 0x7f800000 | ~uVar66 & 0xff800000) & auVar230._4_4_;
          auVar258._8_4_ = (uVar69 & 0x7f800000 | ~uVar69 & 0xff800000) & auVar230._8_4_;
          auVar258._12_4_ = (uVar116 & 0x7f800000 | ~uVar116 & 0xff800000) & auVar230._12_4_;
          auVar231._0_4_ = ~auVar230._0_4_ & auVar238._0_4_;
          auVar231._4_4_ = ~auVar230._4_4_ & auVar238._4_4_;
          auVar231._8_4_ = ~auVar230._8_4_ & auVar238._8_4_;
          auVar231._12_4_ = ~auVar230._12_4_ & auVar238._12_4_;
          auVar166._4_4_ = -(uint)((fVar188 <= fVar322 || auVar154._4_4_ <= 0.0) && bVar12);
          auVar166._0_4_ = -(uint)((fVar162 <= fVar319 || auVar154._0_4_ <= 0.0) && bVar62);
          auVar166._8_4_ = -(uint)((fVar176 <= fVar336 || auVar154._8_4_ <= 0.0) && bVar13);
          auVar166._12_4_ = -(uint)((fVar213 <= fVar342 || auVar154._12_4_ <= 0.0) && bVar14);
          auVar238 = auVar231 | auVar258;
          auVar256 = auVar281 | auVar273;
        }
      }
      fVar162 = (ray->super_RayK<1>).dir.field_0.m128[0];
      fVar188 = (ray->super_RayK<1>).dir.field_0.m128[1];
      fVar176 = (ray->super_RayK<1>).dir.field_0.m128[2];
      uVar65 = (uint)DAT_01f46710;
      uVar66 = DAT_01f46710._4_4_;
      uVar69 = DAT_01f46710._8_4_;
      uVar116 = DAT_01f46710._12_4_;
      auVar77 = minps((undefined1  [16])tp1.upper.field_0,auVar256);
      aVar257 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                maxps((undefined1  [16])local_4f8,auVar238);
      tp1.lower.field_0 = aVar257;
      local_358._0_4_ = -(uint)(fVar288 <= auVar77._0_4_) & auVar99._0_4_;
      local_358._4_4_ = -(uint)(fVar297 <= auVar77._4_4_) & auVar99._4_4_;
      fStack_350 = (float)(-(uint)(fVar303 <= auVar77._8_4_) & auVar99._8_4_);
      fStack_34c = (float)(-(uint)(fVar311 <= auVar77._12_4_) & auVar99._12_4_);
      local_368 = (undefined1  [8])
                  CONCAT44(-(uint)(aVar257.v[1] <= tp1.upper.field_0._4_4_) & auVar99._4_4_,
                           -(uint)(aVar257.v[0] <= tp1.upper.field_0._0_4_) & auVar99._0_4_);
      fStack_360 = (float)(-(uint)(aVar257.v[2] <= tp1.upper.field_0._8_4_) & auVar99._8_4_);
      fStack_35c = (float)(-(uint)(aVar257.v[3] <= tp1.upper.field_0._12_4_) & auVar99._12_4_);
      auVar102._8_4_ = fStack_360;
      auVar102._0_8_ = local_368;
      auVar102._12_4_ = fStack_35c;
      iVar50 = movmskps(iVar50,auVar102 | _local_358);
      pRVar54 = (RTCRayN *)CONCAT44(uVar52,iVar50);
      if (iVar50 != 0) {
        local_378 = (float)local_614;
        fStack_374 = (float)local_614;
        fStack_370 = (float)local_614;
        fStack_36c = (float)local_614;
        local_508._0_4_ =
             -(uint)((int)local_614 <
                    ((int)((-(uint)(0.3 <= (float)((uint)((float)local_508._0_4_ * fVar176 +
                                                          (float)local_5d8._0_4_ * fVar188 +
                                                         local_628 * fVar162) & uVar65)) &
                           auVar166._0_4_) << 0x1f) >> 0x1f) + 4);
        local_508._4_4_ =
             -(uint)((int)local_614 <
                    ((int)((-(uint)(0.3 <= (float)((uint)((float)local_508._4_4_ * fVar176 +
                                                          (float)local_5d8._4_4_ * fVar188 +
                                                         fStack_624 * fVar162) & uVar66)) &
                           auVar166._4_4_) << 0x1f) >> 0x1f) + 4);
        fStack_500 = (float)-(uint)((int)local_614 <
                                   ((int)((-(uint)(0.3 <= (float)((uint)(fStack_500 * fVar176 +
                                                                         fStack_5d0 * fVar188 +
                                                                        fStack_620 * fVar162) &
                                                                 uVar69)) & auVar166._8_4_) << 0x1f)
                                   >> 0x1f) + 4);
        fStack_4fc = (float)-(uint)((int)local_614 <
                                   ((int)((-(uint)(0.3 <= (float)((uint)(fStack_4fc * fVar176 +
                                                                         fStack_5cc * fVar188 +
                                                                        fStack_61c * fVar162) &
                                                                 uVar116)) & auVar166._12_4_) <<
                                         0x1f) >> 0x1f) + 4);
        auVar103 = ~_local_508 & _local_358;
        auVar77 = _DAT_01f46710;
        while( true ) {
          local_258 = auVar103;
          uVar52 = (undefined4)((ulong)pRVar54 >> 0x20);
          iVar50 = movmskps((int)pRVar54,auVar103);
          pRVar54 = (RTCRayN *)CONCAT44(uVar52,iVar50);
          if (iVar50 == 0) break;
          uVar118 = auVar103._0_4_;
          uVar120 = auVar103._4_4_;
          uVar119 = auVar103._8_4_;
          uVar121 = auVar103._12_4_;
          auVar134._0_4_ = uVar118 & local_4f8.i[0];
          auVar134._4_4_ = uVar120 & local_4f8.i[1];
          auVar134._8_4_ = uVar119 & local_4f8.i[2];
          auVar134._12_4_ = uVar121 & local_4f8.i[3];
          auVar155._0_8_ = CONCAT44(~uVar120,~uVar118) & 0x7f8000007f800000;
          auVar155._8_4_ = ~uVar119 & 0x7f800000;
          auVar155._12_4_ = ~uVar121 & 0x7f800000;
          auVar155 = auVar155 | auVar134;
          auVar167._4_4_ = auVar155._0_4_;
          auVar167._0_4_ = auVar155._4_4_;
          auVar167._8_4_ = auVar155._12_4_;
          auVar167._12_4_ = auVar155._8_4_;
          auVar252 = minps(auVar167,auVar155);
          auVar135._0_8_ = auVar252._8_8_;
          auVar135._8_4_ = auVar252._0_4_;
          auVar135._12_4_ = auVar252._4_4_;
          auVar252 = minps(auVar135,auVar252);
          auVar136._0_8_ =
               CONCAT44(-(uint)(auVar252._4_4_ == auVar155._4_4_) & uVar120,
                        -(uint)(auVar252._0_4_ == auVar155._0_4_) & uVar118);
          auVar136._8_4_ = -(uint)(auVar252._8_4_ == auVar155._8_4_) & uVar119;
          auVar136._12_4_ = -(uint)(auVar252._12_4_ == auVar155._12_4_) & uVar121;
          iVar50 = movmskps(iVar50,auVar136);
          if (iVar50 != 0) {
            auVar103._8_4_ = auVar136._8_4_;
            auVar103._0_8_ = auVar136._0_8_;
            auVar103._12_4_ = auVar136._12_4_;
          }
          uVar51 = movmskps(iVar50,auVar103);
          uVar59 = CONCAT44(uVar52,uVar51);
          pRVar54 = (RTCRayN *)0x0;
          if (uVar59 != 0) {
            for (; (uVar59 >> (long)pRVar54 & 1) == 0; pRVar54 = pRVar54 + 1) {
            }
          }
          *(undefined4 *)(local_258 + (long)pRVar54 * 4) = 0;
          pVVar1 = &(ray->super_RayK<1>).dir;
          fVar175 = (pVVar1->field_0).m128[0];
          fVar178 = (ray->super_RayK<1>).dir.field_0.m128[1];
          fVar185 = (ray->super_RayK<1>).dir.field_0.m128[2];
          aVar49 = (pVVar1->field_0).field_1;
          auVar27._4_4_ = fVar212;
          auVar27._0_4_ = fVar187;
          auVar27._8_4_ = fVar215;
          auVar27._12_4_ = fVar246;
          auVar25._4_4_ = fVar259;
          auVar25._0_4_ = fVar247;
          auVar25._8_4_ = fVar262;
          auVar25._12_4_ = fVar267;
          auVar225 = minps(auVar27,auVar25);
          auVar226 = maxps(auVar27,auVar25);
          auVar23._4_4_ = fVar276;
          auVar23._0_4_ = fVar274;
          auVar23._8_4_ = fVar279;
          auVar23._12_4_ = fVar282;
          auVar21._4_4_ = fVar143;
          auVar21._0_4_ = fVar160;
          auVar21._8_4_ = fVar144;
          auVar21._12_4_ = fVar284;
          auVar252 = minps(auVar23,auVar21);
          auVar225 = minps(auVar225,auVar252);
          auVar252 = maxps(auVar23,auVar21);
          auVar226 = maxps(auVar226,auVar252);
          auVar206._0_4_ = auVar225._0_4_ & auVar77._0_4_;
          auVar206._4_4_ = auVar225._4_4_ & auVar77._4_4_;
          auVar206._8_4_ = auVar225._8_4_ & auVar77._8_4_;
          auVar206._12_4_ = auVar225._12_4_ & auVar77._12_4_;
          auVar104._0_4_ = auVar226._0_4_ & auVar77._0_4_;
          auVar104._4_4_ = auVar226._4_4_ & auVar77._4_4_;
          auVar104._8_4_ = auVar226._8_4_ & auVar77._8_4_;
          auVar104._12_4_ = (uint)auVar226._12_4_ & auVar77._12_4_;
          auVar252 = maxps(auVar206,auVar104);
          fVar186 = auVar252._4_4_;
          if (auVar252._4_4_ <= auVar252._0_4_) {
            fVar186 = auVar252._0_4_;
          }
          auVar207._8_8_ = auVar252._8_8_;
          auVar207._0_8_ = auVar252._8_8_;
          if (auVar252._8_4_ <= fVar186) {
            auVar207._0_4_ = fVar186;
          }
          fVar177 = auVar207._0_4_ * 1.9073486e-06;
          fVar186 = *(float *)(local_108 + (long)pRVar54 * 4);
          fVar213 = local_118[(long)(pRVar54 + -8)];
          lVar61 = 5;
          do {
            bVar62 = lVar61 == 0;
            lVar61 = lVar61 + -1;
            if (bVar62) goto LAB_002f6535;
            local_608 = aVar49.x;
            fStack_604 = aVar49.y;
            fStack_600 = aVar49.z;
            aStack_5fc = aVar49.field_3;
            fVar268 = SQRT(fVar185 * fVar185 + fVar178 * fVar178 + fVar175 * fVar175) *
                      1.9073486e-06 * fVar213;
            fVar275 = 1.0 - fVar186;
            fVar216 = fVar186 * 3.0;
            fVar214 = -fVar186 * fVar275 * fVar275 * 0.5;
            fVar277 = (fVar186 * fVar186 * (fVar216 + -5.0) + 2.0) * 0.5;
            fVar217 = ((fVar275 * 3.0 + -5.0) * fVar275 * fVar275 + 2.0) * 0.5;
            fVar218 = -fVar275 * fVar186 * fVar186 * 0.5;
            local_4d8 = fVar214 * fVar187 +
                        fVar277 * fVar247 + fVar217 * fVar274 + fVar218 * fVar160;
            fStack_4d4 = fVar214 * fVar212 +
                         fVar277 * fVar259 + fVar217 * fVar276 + fVar218 * fVar143;
            fStack_4d0 = fVar214 * fVar215 +
                         fVar277 * fVar262 + fVar217 * fVar279 + fVar218 * fVar144;
            fStack_4cc = fVar214 * fVar246 +
                         fVar277 * fVar267 + fVar217 * fVar282 + fVar218 * fVar284;
            fVar218 = (fVar186 * (fVar275 + fVar275) - fVar275 * fVar275) * 0.5;
            fVar277 = ((fVar186 + fVar186) * (fVar216 + -5.0) + fVar186 * fVar216) * 0.5;
            fVar217 = ((fVar216 + 2.0) * (fVar275 + fVar275) + fVar275 * -3.0 * fVar275) * 0.5;
            fVar214 = (fVar275 * -2.0 * fVar186 + fVar186 * fVar186) * 0.5;
            fVar280 = fVar218 * fVar187 + fVar277 * fVar247 + fVar217 * fVar274 + fVar214 * fVar160;
            fVar263 = fVar218 * fVar212 + fVar277 * fVar259 + fVar217 * fVar276 + fVar214 * fVar143;
            fVar283 = fVar218 * fVar215 + fVar277 * fVar262 + fVar217 * fVar279 + fVar214 * fVar144;
            fVar265 = fVar218 * fVar246 + fVar277 * fVar267 + fVar217 * fVar282 + fVar214 * fVar284;
            fVar275 = fVar186 * -3.0 + 2.0;
            fVar218 = fVar186 * 9.0 + -5.0;
            fVar214 = fVar186 * -9.0 + 4.0;
            fVar216 = fVar216 + -1.0;
            fVar217 = fVar275 * fVar187 + fVar218 * fVar247 + fVar214 * fVar274 + fVar216 * fVar160;
            fVar277 = fVar275 * fVar212 + fVar218 * fVar259 + fVar214 * fVar276 + fVar216 * fVar143;
            fVar218 = fVar275 * fVar215 + fVar218 * fVar262 + fVar214 * fVar279 + fVar216 * fVar144;
            fVar219 = (fVar213 * local_608 + 0.0) - local_4d8;
            fVar248 = (fVar213 * fStack_604 + 0.0) - fStack_4d4;
            fVar278 = (fVar213 * fStack_600 + 0.0) - fStack_4d0;
            fVar260 = (fVar213 * aStack_5fc.w + 0.0) - fStack_4cc;
            fVar214 = fVar248 * fVar248;
            fVar216 = fVar278 * fVar278;
            fVar275 = fVar260 * fVar260;
            auVar293._0_4_ = fVar214 + fVar219 * fVar219 + fVar216;
            auVar293._4_4_ = fVar214 + fVar214 + fVar275;
            auVar293._8_4_ = fVar214 + fVar216 + fVar216;
            auVar293._12_4_ = fVar214 + fVar275 + fVar275;
            fVar214 = fVar177;
            if (fVar177 <= fVar268) {
              fVar214 = fVar268;
            }
            fVar216 = fVar263 * fVar263 + fVar280 * fVar280 + fVar283 * fVar283;
            auVar252 = ZEXT416((uint)fVar216);
            auVar77 = rsqrtss(ZEXT416((uint)fVar216),auVar252);
            fVar268 = auVar77._0_4_;
            fVar275 = fVar268 * 1.5 - fVar268 * fVar268 * fVar216 * 0.5 * fVar268;
            fVar296 = fVar280 * fVar275;
            fVar298 = fVar263 * fVar275;
            fVar299 = fVar283 * fVar275;
            fVar301 = fVar265 * fVar275;
            fVar289 = fVar218 * fVar283 + fVar277 * fVar263 + fVar217 * fVar280;
            auVar77 = rcpss(auVar252,auVar252);
            fVar268 = (2.0 - fVar216 * auVar77._0_4_) * auVar77._0_4_;
            fVar285 = fVar248 * fVar298;
            fVar286 = fVar278 * fVar299;
            fVar287 = fVar260 * fVar301;
            fVar304 = fVar285 + fVar219 * fVar296 + fVar286;
            fVar310 = fVar285 + fVar285 + fVar287;
            fVar286 = fVar285 + fVar286 + fVar286;
            fVar287 = fVar285 + fVar287 + fVar287;
            fVar285 = (SQRT(auVar293._0_4_) + 1.0) * (fVar177 / SQRT(fVar216)) +
                      SQRT(auVar293._0_4_) * fVar177 + fVar214;
            fVar302 = fVar301 * -fVar265;
            fVar217 = fVar299 * -fVar283 + fVar298 * -fVar263 + fVar296 * -fVar280 +
                      fVar268 * (fVar216 * fVar218 - fVar289 * fVar283) * fVar275 * fVar278 +
                      fVar268 * (fVar216 * fVar277 - fVar289 * fVar263) * fVar275 * fVar248 +
                      fVar268 * (fVar216 * fVar217 - fVar289 * fVar280) * fVar275 * fVar219;
            fVar275 = fStack_600 * fVar299 + fStack_604 * fVar298 + local_608 * fVar296;
            fVar268 = auVar293._0_4_ - fVar304 * fVar304;
            auVar105._0_8_ = CONCAT44(auVar293._4_4_ - fVar310 * fVar310,fVar268);
            auVar105._8_4_ = auVar293._8_4_ - fVar286 * fVar286;
            auVar105._12_4_ = auVar293._12_4_ - fVar287 * fVar287;
            fVar277 = -fVar265 * fVar260;
            auVar137._8_4_ = auVar105._8_4_;
            auVar137._0_8_ = auVar105._0_8_;
            auVar137._12_4_ = auVar105._12_4_;
            auVar77 = rsqrtss(auVar137,auVar105);
            fVar216 = auVar77._0_4_;
            fVar216 = fVar216 * 1.5 - fVar216 * fVar216 * fVar268 * 0.5 * fVar216;
            if (fVar268 < 0.0) {
              fVar268 = sqrtf(fVar268);
              pRVar54 = extraout_RAX;
              p_Var57 = extraout_RDX;
            }
            else {
              fVar268 = SQRT(fVar268);
            }
            auVar77 = _DAT_01f46710;
            fVar268 = fVar268 - fStack_4cc;
            fVar218 = ((-fVar283 * fVar278 + -fVar263 * fVar248 + -fVar280 * fVar219) -
                      fVar304 * fVar217) * fVar216 - fVar265;
            fVar216 = ((fStack_600 * fVar278 + fStack_604 * fVar248 + local_608 * fVar219) -
                      fVar304 * fVar275) * fVar216;
            auVar326._0_8_ = CONCAT44(fVar277,fVar218) ^ 0x8000000080000000;
            auVar209._4_4_ = fVar302;
            auVar209._0_4_ = fVar217;
            auVar168._0_4_ = fVar217 * fVar216 - fVar275 * fVar218;
            auVar326._8_4_ = -fVar277;
            auVar326._12_4_ = aStack_5fc.w * fVar260;
            auVar325._8_8_ = auVar326._8_8_;
            auVar325._0_8_ = CONCAT44(fVar216,fVar218) ^ 0x80000000;
            auVar168._4_4_ = auVar168._0_4_;
            auVar168._8_4_ = auVar168._0_4_;
            auVar168._12_4_ = auVar168._0_4_;
            auVar225 = divps(auVar325,auVar168);
            auVar209._8_4_ = fVar302;
            auVar209._12_4_ = -(aStack_5fc.w * fVar301);
            auVar208._8_8_ = auVar209._8_8_;
            auVar208._0_8_ = CONCAT44(fVar275,fVar217) ^ 0x8000000000000000;
            auVar252 = divps(auVar208,auVar168);
            fVar213 = fVar213 - (fVar268 * auVar252._0_4_ + fVar304 * auVar225._0_4_);
            fVar186 = fVar186 - (fVar268 * auVar252._4_4_ + fVar304 * auVar225._4_4_);
          } while ((fVar285 <= (float)((uint)fVar304 & (uint)DAT_01f46710)) ||
                  (auVar226._12_4_ * 1.9073486e-06 + fVar214 + fVar285 <=
                   (float)((uint)fVar268 & (uint)DAT_01f46710)));
          fVar213 = local_338._0_4_ + fVar213;
          if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar213) &&
             (((fVar175 = (ray->super_RayK<1>).tfar, fVar213 <= fVar175 && (0.0 <= fVar186)) &&
              (fVar186 <= 1.0)))) {
            auVar252 = rsqrtss(auVar293,auVar293);
            fVar178 = auVar252._0_4_;
            pGVar10 = (context->scene->geometries).items[uVar63].ptr;
            uVar118 = (ray->super_RayK<1>).mask;
            pRVar54 = (RTCRayN *)(ulong)uVar118;
            if ((pGVar10->mask & uVar118) != 0) {
              fVar178 = fVar178 * 1.5 + fVar178 * fVar178 * auVar293._0_4_ * -0.5 * fVar178;
              fVar219 = fVar219 * fVar178;
              fVar248 = fVar248 * fVar178;
              fVar278 = fVar278 * fVar178;
              fVar178 = fVar265 * fVar219 + fVar280;
              fVar185 = fVar265 * fVar248 + fVar263;
              fVar177 = fVar265 * fVar278 + fVar283;
              fVar268 = fVar248 * fVar280 - fVar263 * fVar219;
              fVar216 = fVar278 * fVar263 - fVar283 * fVar248;
              fVar275 = fVar219 * fVar283 - fVar280 * fVar278;
              fVar214 = fVar185 * fVar216 - fVar275 * fVar178;
              uVar123 = CONCAT44(fVar178 * fVar268 - fVar216 * fVar177,
                                 fVar177 * fVar275 - fVar268 * fVar185);
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                (ray->super_RayK<1>).tfar = fVar213;
                *(undefined8 *)&(ray->Ng).field_0 = uVar123;
                (ray->Ng).field_0.field_0.z = fVar214;
                ray->u = fVar186;
                ray->v = 0.0;
                ray->primID = uVar64;
                ray->geomID = uVar63;
                ray->instID[0] = context->user->instID[0];
                uVar118 = context->user->instPrimID[0];
                ray->instPrimID[0] = uVar118;
                pRVar54 = (RTCRayN *)(ulong)uVar118;
              }
              else {
                vu0.field_0._0_8_ = uVar123;
                vu0.field_0.v[2] = fVar214;
                vu0.field_0.v[3] = fVar186;
                (ray->super_RayK<1>).tfar = fVar213;
                local_388._0_4_ = 0xffffffff;
                args.geometryUserPtr = pGVar10->userPtr;
                args.valid = (int *)local_388;
                args.context = context->user;
                args.hit = (RTCHitN *)&vu0;
                args.N = 1;
                args.ray = (RTCRayN *)ray;
                if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002f6657:
                  p_Var57 = context->args->filter;
                  if ((p_Var57 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var57)(&args);
                    p_Var57 = extraout_RDX_01;
                    auVar77 = _DAT_01f46710;
                    if (*args.valid == 0) goto LAB_002f66f4;
                  }
                  *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                  *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                  *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                  *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                  *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                  *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                  *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                  p_Var57 = (RTCFilterFunctionN)(ulong)*(uint *)(args.hit + 0x1c);
                  *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                  *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
                  pRVar54 = args.ray;
                }
                else {
                  (*pGVar10->intersectionFilterN)(&args);
                  p_Var57 = extraout_RDX_00;
                  auVar77 = _DAT_01f46710;
                  if (*args.valid != 0) goto LAB_002f6657;
LAB_002f66f4:
                  auVar77 = _DAT_01f46710;
                  (ray->super_RayK<1>).tfar = fVar175;
                  pRVar54 = (RTCRayN *)args.valid;
                }
              }
            }
          }
LAB_002f6535:
          fVar175 = (ray->super_RayK<1>).tfar;
          auVar103._0_4_ = -(uint)(fVar234 + fVar288 <= fVar175) & local_258._0_4_;
          auVar103._4_4_ = -(uint)(fVar234 + fVar297 <= fVar175) & local_258._4_4_;
          auVar103._8_4_ = -(uint)(fVar234 + fVar303 <= fVar175) & local_258._8_4_;
          auVar103._12_4_ = -(uint)(fVar234 + fVar311 <= fVar175) & local_258._12_4_;
        }
        fVar213 = (ray->super_RayK<1>).tfar;
        auVar169._0_4_ = -(uint)(aVar257.v[0] + fVar234 <= fVar213) & local_368._0_4_;
        auVar169._4_4_ = -(uint)(aVar257.v[1] + fVar234 <= fVar213) & local_368._4_4_;
        auVar169._8_4_ = -(uint)(aVar257.v[2] + fVar234 <= fVar213) & (uint)fStack_360;
        auVar169._12_4_ = -(uint)(aVar257.v[3] + fVar234 <= fVar213) & (uint)fStack_35c;
        auVar138._0_4_ =
             -(uint)((int)local_378 <
                    ((int)((-(uint)(0.3 <= (float)((uint)(auVar317._0_4_ * fVar162 +
                                                         fVar295 * fVar188 + fVar315 * fVar176) &
                                                  uVar65)) & auVar166._0_4_) << 0x1f) >> 0x1f) + 4);
        auVar138._4_4_ =
             -(uint)((int)fStack_374 <
                    ((int)((-(uint)(0.3 <= (float)((uint)(auVar317._4_4_ * fVar162 +
                                                         fVar300 * fVar188 + fVar318 * fVar176) &
                                                  uVar66)) & auVar166._4_4_) << 0x1f) >> 0x1f) + 4);
        auVar138._8_4_ =
             -(uint)((int)fStack_370 <
                    ((int)((-(uint)(0.3 <= (float)((uint)(auVar317._8_4_ * fVar162 +
                                                         fVar309 * fVar188 + fVar320 * fVar176) &
                                                  uVar69)) & auVar166._8_4_) << 0x1f) >> 0x1f) + 4);
        auVar138._12_4_ =
             -(uint)((int)fStack_36c <
                    ((int)((-(uint)(0.3 <= (float)((uint)(auVar317._12_4_ * fVar162 +
                                                         fVar313 * fVar188 + fVar174 * fVar176) &
                                                  uVar116)) & auVar166._12_4_) << 0x1f) >> 0x1f) + 4
                    );
        auVar139 = ~auVar138 & auVar169;
        local_4f8 = tp1.lower.field_0;
        fVar295 = fVar234 + tp1.lower.field_0.v[0];
        fVar300 = fVar234 + tp1.lower.field_0.v[1];
        fVar309 = fVar234 + tp1.lower.field_0.v[2];
        fVar313 = fVar234 + tp1.lower.field_0.v[3];
        fVar175 = local_4e8;
        fVar178 = fStack_4e4;
        fVar185 = fStack_4e0;
        fVar186 = fStack_4dc;
        while( true ) {
          local_388 = auVar139;
          iVar50 = movmskps((int)pRVar54,auVar139);
          if (iVar50 == 0) break;
          auVar225 = ~auVar139 & _DAT_01f45a30 | auVar139 & (undefined1  [16])local_4f8;
          auVar170._4_4_ = auVar225._0_4_;
          auVar170._0_4_ = auVar225._4_4_;
          auVar170._8_4_ = auVar225._12_4_;
          auVar170._12_4_ = auVar225._8_4_;
          auVar252 = minps(auVar170,auVar225);
          auVar106._0_8_ = auVar252._8_8_;
          auVar106._8_4_ = auVar252._0_4_;
          auVar106._12_4_ = auVar252._4_4_;
          auVar252 = minps(auVar106,auVar252);
          auVar107._0_8_ =
               CONCAT44(-(uint)(auVar252._4_4_ == auVar225._4_4_) & auVar139._4_4_,
                        -(uint)(auVar252._0_4_ == auVar225._0_4_) & auVar139._0_4_);
          auVar107._8_4_ = -(uint)(auVar252._8_4_ == auVar225._8_4_) & auVar139._8_4_;
          auVar107._12_4_ = -(uint)(auVar252._12_4_ == auVar225._12_4_) & auVar139._12_4_;
          iVar50 = movmskps(iVar50,auVar107);
          if (iVar50 != 0) {
            auVar139._8_4_ = auVar107._8_4_;
            auVar139._0_8_ = auVar107._0_8_;
            auVar139._12_4_ = auVar107._12_4_;
          }
          uVar52 = movmskps(iVar50,auVar139);
          uVar59 = CONCAT44((int)((ulong)pRVar54 >> 0x20),uVar52);
          pRVar54 = (RTCRayN *)0x0;
          if (uVar59 != 0) {
            for (; (uVar59 >> (long)pRVar54 & 1) == 0; pRVar54 = pRVar54 + 1) {
            }
          }
          *(undefined4 *)(local_388 + (long)pRVar54 * 4) = 0;
          pVVar1 = &(ray->super_RayK<1>).dir;
          fVar315 = (pVVar1->field_0).m128[0];
          fVar318 = (ray->super_RayK<1>).dir.field_0.m128[1];
          fVar320 = (ray->super_RayK<1>).dir.field_0.m128[2];
          aVar49 = (pVVar1->field_0).field_1;
          auVar28._4_4_ = fVar212;
          auVar28._0_4_ = fVar187;
          auVar28._8_4_ = fVar215;
          auVar28._12_4_ = fVar246;
          auVar26._4_4_ = fVar259;
          auVar26._0_4_ = fVar247;
          auVar26._8_4_ = fVar262;
          auVar26._12_4_ = fVar267;
          auVar225 = minps(auVar28,auVar26);
          auVar226 = maxps(auVar28,auVar26);
          auVar24._4_4_ = fVar276;
          auVar24._0_4_ = fVar274;
          auVar24._8_4_ = fVar279;
          auVar24._12_4_ = fVar282;
          auVar22._4_4_ = fVar143;
          auVar22._0_4_ = fVar160;
          auVar22._8_4_ = fVar144;
          auVar22._12_4_ = fVar284;
          auVar252 = minps(auVar24,auVar22);
          auVar225 = minps(auVar225,auVar252);
          auVar252 = maxps(auVar24,auVar22);
          auVar226 = maxps(auVar226,auVar252);
          auVar210._0_4_ = auVar225._0_4_ & auVar77._0_4_;
          auVar210._4_4_ = auVar225._4_4_ & auVar77._4_4_;
          auVar210._8_4_ = auVar225._8_4_ & auVar77._8_4_;
          auVar210._12_4_ = auVar225._12_4_ & auVar77._12_4_;
          auVar108._0_4_ = auVar226._0_4_ & auVar77._0_4_;
          auVar108._4_4_ = auVar226._4_4_ & auVar77._4_4_;
          auVar108._8_4_ = auVar226._8_4_ & auVar77._8_4_;
          auVar108._12_4_ = (uint)auVar226._12_4_ & auVar77._12_4_;
          auVar252 = maxps(auVar210,auVar108);
          fVar174 = auVar252._4_4_;
          if (auVar252._4_4_ <= auVar252._0_4_) {
            fVar174 = auVar252._0_4_;
          }
          auVar211._8_8_ = auVar252._8_8_;
          auVar211._0_8_ = auVar252._8_8_;
          if (auVar252._8_4_ <= fVar174) {
            auVar211._0_4_ = fVar174;
          }
          fVar188 = auVar211._0_4_ * 1.9073486e-06;
          fVar174 = local_118[(long)pRVar54];
          fVar162 = tp1.upper.field_0.v[(long)pRVar54];
          lVar61 = 5;
          do {
            bVar62 = lVar61 == 0;
            lVar61 = lVar61 + -1;
            if (bVar62) goto LAB_002f6ff7;
            local_608 = aVar49.x;
            fStack_604 = aVar49.y;
            fStack_600 = aVar49.z;
            aStack_5fc = aVar49.field_3;
            fVar175 = SQRT(fVar320 * fVar320 + fVar318 * fVar318 + fVar315 * fVar315) *
                      1.9073486e-06 * fVar162;
            fVar186 = 1.0 - fVar174;
            fVar185 = fVar174 * 3.0;
            fVar178 = -fVar174 * fVar186 * fVar186 * 0.5;
            fVar213 = (fVar174 * fVar174 * (fVar185 + -5.0) + 2.0) * 0.5;
            fVar176 = ((fVar186 * 3.0 + -5.0) * fVar186 * fVar186 + 2.0) * 0.5;
            fVar177 = -fVar186 * fVar174 * fVar174 * 0.5;
            local_4d8 = fVar178 * fVar187 +
                        fVar213 * fVar247 + fVar176 * fVar274 + fVar177 * fVar160;
            fStack_4d4 = fVar178 * fVar212 +
                         fVar213 * fVar259 + fVar176 * fVar276 + fVar177 * fVar143;
            fStack_4d0 = fVar178 * fVar215 +
                         fVar213 * fVar262 + fVar176 * fVar279 + fVar177 * fVar144;
            fStack_4cc = fVar178 * fVar246 +
                         fVar213 * fVar267 + fVar176 * fVar282 + fVar177 * fVar284;
            fVar177 = (fVar174 * (fVar186 + fVar186) - fVar186 * fVar186) * 0.5;
            fVar213 = ((fVar174 + fVar174) * (fVar185 + -5.0) + fVar174 * fVar185) * 0.5;
            fVar176 = ((fVar185 + 2.0) * (fVar186 + fVar186) + fVar186 * -3.0 * fVar186) * 0.5;
            fVar178 = (fVar186 * -2.0 * fVar174 + fVar174 * fVar174) * 0.5;
            fVar217 = fVar177 * fVar187 + fVar213 * fVar247 + fVar176 * fVar274 + fVar178 * fVar160;
            fVar277 = fVar177 * fVar212 + fVar213 * fVar259 + fVar176 * fVar276 + fVar178 * fVar143;
            fVar218 = fVar177 * fVar215 + fVar213 * fVar262 + fVar176 * fVar279 + fVar178 * fVar144;
            fVar219 = fVar177 * fVar246 + fVar213 * fVar267 + fVar176 * fVar282 + fVar178 * fVar284;
            fVar186 = fVar174 * -3.0 + 2.0;
            fVar176 = fVar174 * 9.0 + -5.0;
            fVar178 = fVar174 * -9.0 + 4.0;
            fVar185 = fVar185 + -1.0;
            fVar213 = fVar186 * fVar187 + fVar176 * fVar247 + fVar178 * fVar274 + fVar185 * fVar160;
            fVar177 = fVar186 * fVar212 + fVar176 * fVar259 + fVar178 * fVar276 + fVar185 * fVar143;
            fVar214 = fVar186 * fVar215 + fVar176 * fVar262 + fVar178 * fVar279 + fVar185 * fVar144;
            fVar268 = (fVar162 * local_608 + 0.0) - local_4d8;
            fVar216 = (fVar162 * fStack_604 + 0.0) - fStack_4d4;
            fVar275 = (fVar162 * fStack_600 + 0.0) - fStack_4d0;
            fVar248 = (fVar162 * aStack_5fc.w + 0.0) - fStack_4cc;
            fVar178 = fVar216 * fVar216;
            fVar185 = fVar275 * fVar275;
            fVar186 = fVar248 * fVar248;
            auVar308._0_4_ = fVar178 + fVar268 * fVar268 + fVar185;
            auVar308._4_4_ = fVar178 + fVar178 + fVar186;
            auVar308._8_4_ = fVar178 + fVar185 + fVar185;
            auVar308._12_4_ = fVar178 + fVar186 + fVar186;
            fVar176 = fVar188;
            if (fVar188 <= fVar175) {
              fVar176 = fVar175;
            }
            fVar178 = fVar277 * fVar277 + fVar217 * fVar217 + fVar218 * fVar218;
            auVar252 = ZEXT416((uint)fVar178);
            auVar77 = rsqrtss(ZEXT416((uint)fVar178),auVar252);
            fVar175 = auVar77._0_4_;
            fVar185 = fVar175 * 1.5 - fVar175 * fVar175 * fVar178 * 0.5 * fVar175;
            fVar265 = fVar217 * fVar185;
            fVar285 = fVar277 * fVar185;
            fVar286 = fVar218 * fVar185;
            fVar287 = fVar219 * fVar185;
            fVar280 = fVar214 * fVar218 + fVar177 * fVar277 + fVar213 * fVar217;
            auVar77 = rcpss(auVar252,auVar252);
            fVar175 = (2.0 - fVar178 * auVar77._0_4_) * auVar77._0_4_;
            fVar186 = fVar216 * fVar285;
            fVar278 = fVar275 * fVar286;
            fVar260 = fVar248 * fVar287;
            fVar263 = fVar186 + fVar268 * fVar265 + fVar278;
            fVar283 = fVar186 + fVar186 + fVar260;
            fVar278 = fVar186 + fVar278 + fVar278;
            fVar260 = fVar186 + fVar260 + fVar260;
            fVar289 = (SQRT(auVar308._0_4_) + 1.0) * (fVar188 / SQRT(fVar178)) +
                      SQRT(auVar308._0_4_) * fVar188 + fVar176;
            auVar239._0_4_ = fVar265 * -fVar217;
            auVar239._4_4_ = fVar285 * -fVar277;
            auVar239._8_4_ = fVar286 * -fVar218;
            auVar239._12_4_ = fVar287 * -fVar219;
            auVar240._8_8_ = auVar239._8_8_;
            auVar240._0_8_ = auVar240._8_8_;
            auVar241._4_12_ = auVar240._4_12_;
            auVar241._0_4_ =
                 auVar239._8_4_ + auVar239._4_4_ + auVar239._0_4_ +
                 fVar175 * (fVar178 * fVar214 - fVar280 * fVar218) * fVar185 * fVar275 +
                 fVar175 * (fVar178 * fVar177 - fVar280 * fVar277) * fVar185 * fVar216 +
                 fVar175 * (fVar178 * fVar213 - fVar280 * fVar217) * fVar185 * fVar268;
            auVar243._0_8_ = auVar241._0_8_;
            fVar178 = fStack_600 * fVar286 + fStack_604 * fVar285 + local_608 * fVar265;
            fVar213 = auVar308._0_4_ - fVar263 * fVar263;
            auVar109._0_8_ = CONCAT44(auVar308._4_4_ - fVar283 * fVar283,fVar213);
            auVar109._8_4_ = auVar308._8_4_ - fVar278 * fVar278;
            auVar109._12_4_ = auVar308._12_4_ - fVar260 * fVar260;
            fVar185 = -fVar219 * fVar248;
            auVar140._8_4_ = auVar109._8_4_;
            auVar140._0_8_ = auVar109._0_8_;
            auVar140._12_4_ = auVar109._12_4_;
            auVar77 = rsqrtss(auVar140,auVar109);
            fVar175 = auVar77._0_4_;
            fVar175 = fVar175 * 1.5 - fVar175 * fVar175 * fVar213 * 0.5 * fVar175;
            if (fVar213 < 0.0) {
              fVar213 = sqrtf(fVar213);
              pRVar54 = extraout_RAX_00;
              p_Var57 = extraout_RDX_02;
            }
            else {
              fVar213 = SQRT(fVar213);
            }
            auVar77 = _DAT_01f46710;
            fVar213 = fVar213 - fStack_4cc;
            fVar186 = ((-fVar218 * fVar275 + -fVar277 * fVar216 + -fVar217 * fVar268) -
                      fVar263 * auVar241._0_4_) * fVar175 - fVar219;
            fVar175 = ((fStack_600 * fVar275 + fStack_604 * fVar216 + local_608 * fVar268) -
                      fVar263 * fVar178) * fVar175;
            auVar328._0_8_ = CONCAT44(fVar185,fVar186) ^ 0x8000000080000000;
            auVar171._0_4_ = auVar241._0_4_ * fVar175 - fVar178 * fVar186;
            auVar328._8_4_ = -fVar185;
            auVar328._12_4_ = aStack_5fc.w * fVar248;
            auVar327._8_8_ = auVar328._8_8_;
            auVar327._0_8_ = CONCAT44(fVar175,fVar186) ^ 0x80000000;
            auVar171._4_4_ = auVar171._0_4_;
            auVar171._8_4_ = auVar171._0_4_;
            auVar171._12_4_ = auVar171._0_4_;
            auVar225 = divps(auVar327,auVar171);
            auVar243._8_4_ = auVar239._12_4_;
            auVar243._12_4_ = -(aStack_5fc.w * fVar287);
            auVar242._8_8_ = auVar243._8_8_;
            auVar242._0_8_ = CONCAT44(fVar178,auVar241._0_4_) ^ 0x8000000000000000;
            auVar252 = divps(auVar242,auVar171);
            fVar162 = fVar162 - (fVar213 * auVar252._0_4_ + fVar263 * auVar225._0_4_);
            fVar174 = fVar174 - (fVar213 * auVar252._4_4_ + fVar263 * auVar225._4_4_);
            fVar175 = local_4e8;
            fVar178 = fStack_4e4;
            fVar185 = fStack_4e0;
            fVar186 = fStack_4dc;
          } while ((fVar289 <= (float)((uint)fVar263 & (uint)DAT_01f46710)) ||
                  (auVar226._12_4_ * 1.9073486e-06 + fVar176 + fVar289 <=
                   (float)((uint)fVar213 & (uint)DAT_01f46710)));
          fVar162 = local_338._0_4_ + fVar162;
          if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar162) &&
             (((fVar315 = (ray->super_RayK<1>).tfar, fVar162 <= fVar315 && (0.0 <= fVar174)) &&
              (fVar174 <= 1.0)))) {
            auVar252 = rsqrtss(auVar308,auVar308);
            fVar318 = auVar252._0_4_;
            pGVar10 = (context->scene->geometries).items[uVar63].ptr;
            uVar65 = (ray->super_RayK<1>).mask;
            pRVar54 = (RTCRayN *)(ulong)uVar65;
            if ((pGVar10->mask & uVar65) != 0) {
              fVar318 = fVar318 * 1.5 + fVar318 * fVar318 * auVar308._0_4_ * -0.5 * fVar318;
              fVar268 = fVar268 * fVar318;
              fVar216 = fVar216 * fVar318;
              fVar275 = fVar275 * fVar318;
              fVar318 = fVar219 * fVar268 + fVar217;
              fVar320 = fVar219 * fVar216 + fVar277;
              fVar188 = fVar219 * fVar275 + fVar218;
              fVar213 = fVar216 * fVar217 - fVar277 * fVar268;
              fVar177 = fVar275 * fVar277 - fVar218 * fVar216;
              fVar214 = fVar268 * fVar218 - fVar217 * fVar275;
              fVar176 = fVar320 * fVar177 - fVar214 * fVar318;
              uVar123 = CONCAT44(fVar318 * fVar213 - fVar177 * fVar188,
                                 fVar188 * fVar214 - fVar213 * fVar320);
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                (ray->super_RayK<1>).tfar = fVar162;
                *(undefined8 *)&(ray->Ng).field_0 = uVar123;
                (ray->Ng).field_0.field_0.z = fVar176;
                ray->u = fVar174;
                ray->v = 0.0;
                ray->primID = uVar64;
                ray->geomID = uVar63;
                ray->instID[0] = context->user->instID[0];
                uVar65 = context->user->instPrimID[0];
                ray->instPrimID[0] = uVar65;
                pRVar54 = (RTCRayN *)(ulong)uVar65;
              }
              else {
                vu0.field_0._0_8_ = uVar123;
                vu0.field_0.v[2] = fVar176;
                vu0.field_0.v[3] = fVar174;
                (ray->super_RayK<1>).tfar = fVar162;
                local_50c = -1;
                args.geometryUserPtr = pGVar10->userPtr;
                args.valid = &local_50c;
                args.context = context->user;
                args.hit = (RTCHitN *)&vu0;
                args.N = 1;
                args.ray = (RTCRayN *)ray;
                if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002f7113:
                  p_Var57 = context->args->filter;
                  if ((p_Var57 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var57)(&args);
                    p_Var57 = extraout_RDX_04;
                    auVar77 = _DAT_01f46710;
                    if (*args.valid == 0) goto LAB_002f71c5;
                  }
                  *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                  *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                  *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                  *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                  *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                  *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                  *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                  p_Var57 = (RTCFilterFunctionN)(ulong)*(uint *)(args.hit + 0x1c);
                  *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                  *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
                  pRVar54 = args.ray;
                  fVar175 = local_4e8;
                  fVar178 = fStack_4e4;
                  fVar185 = fStack_4e0;
                  fVar186 = fStack_4dc;
                }
                else {
                  (*pGVar10->intersectionFilterN)(&args);
                  p_Var57 = extraout_RDX_03;
                  auVar77 = _DAT_01f46710;
                  if (*args.valid != 0) goto LAB_002f7113;
LAB_002f71c5:
                  auVar77 = _DAT_01f46710;
                  (ray->super_RayK<1>).tfar = fVar315;
                  pRVar54 = (RTCRayN *)args.valid;
                  fVar175 = local_4e8;
                  fVar178 = fStack_4e4;
                  fVar185 = fStack_4e0;
                  fVar186 = fStack_4dc;
                }
              }
            }
          }
LAB_002f6ff7:
          fVar213 = (ray->super_RayK<1>).tfar;
          auVar139._0_4_ = -(uint)(fVar295 <= fVar213) & local_388._0_4_;
          auVar139._4_4_ = -(uint)(fVar300 <= fVar213) & local_388._4_4_;
          auVar139._8_4_ = -(uint)(fVar309 <= fVar213) & local_388._8_4_;
          auVar139._12_4_ = -(uint)(fVar313 <= fVar213) & local_388._12_4_;
        }
        auVar184._0_4_ = local_508._0_4_ & local_358._0_4_ & -(uint)(fVar234 + fVar288 <= fVar213);
        auVar184._4_4_ = local_508._4_4_ & local_358._4_4_ & -(uint)(fVar234 + fVar297 <= fVar213);
        auVar184._8_4_ = (uint)fStack_500 & (uint)fStack_350 & -(uint)(fVar234 + fVar303 <= fVar213)
        ;
        auVar184._12_4_ =
             (uint)fStack_4fc & (uint)fStack_34c & -(uint)(fVar234 + fVar311 <= fVar213);
        auVar110._0_4_ =
             auVar138._0_4_ & auVar169._0_4_ & -(uint)(fVar234 + tp1.lower.field_0.v[0] <= fVar213);
        auVar110._4_4_ =
             auVar138._4_4_ & auVar169._4_4_ & -(uint)(fVar234 + tp1.lower.field_0.v[1] <= fVar213);
        auVar110._8_4_ =
             auVar138._8_4_ & auVar169._8_4_ & -(uint)(fVar234 + tp1.lower.field_0.v[2] <= fVar213);
        auVar110._12_4_ =
             auVar138._12_4_ & auVar169._12_4_ &
             -(uint)(fVar234 + tp1.lower.field_0.v[3] <= fVar213);
        uVar65 = movmskps(0,auVar110 | auVar184);
        pRVar54 = (RTCRayN *)(ulong)uVar65;
        if (uVar65 != 0) {
          pRVar54 = (RTCRayN *)((long)p_Var56 * 0x30);
          stack[(long)p_Var56].valid.field_0 =
               (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar110 | auVar184);
          stack[(long)p_Var56].tlower.field_0.i[0] =
               ~auVar184._0_4_ & tp1.lower.field_0.i[0] | (uint)fVar288 & auVar184._0_4_;
          stack[(long)p_Var56].tlower.field_0.i[1] =
               ~auVar184._4_4_ & tp1.lower.field_0.i[1] | (uint)fVar297 & auVar184._4_4_;
          stack[(long)p_Var56].tlower.field_0.i[2] =
               ~auVar184._8_4_ & tp1.lower.field_0.i[2] | (uint)fVar303 & auVar184._8_4_;
          stack[(long)p_Var56].tlower.field_0.i[3] =
               ~auVar184._12_4_ & tp1.lower.field_0.i[3] | (uint)fVar311 & auVar184._12_4_;
          stack[(long)p_Var56].u0 = fVar161;
          stack[(long)p_Var56].u1 = fVar173;
          stack[(long)p_Var56].depth = local_614 + 1;
          p_Var56 = (RTCFilterFunctionN)(ulong)((int)p_Var56 + 1);
        }
      }
    }
    fVar161 = (ray->super_RayK<1>).tfar;
    do {
      p_Var58 = p_Var56;
      iVar50 = (int)p_Var58;
      if (iVar50 == 0) {
        auVar112._4_4_ = -(uint)(fVar115 <= fVar161);
        auVar112._0_4_ = -(uint)(fVar68 <= fVar161);
        auVar112._8_4_ = -(uint)(fVar117 <= fVar161);
        auVar112._12_4_ = -(uint)(fVar122 <= fVar161);
        uVar63 = movmskps((int)pRVar54,auVar112);
        uVar63 = (uint)uVar60 & uVar63;
        goto LAB_002f4b81;
      }
      p_Var56 = (RTCFilterFunctionN)(ulong)(iVar50 - 1U);
      pRVar54 = (RTCRayN *)((long)p_Var56 * 0x30);
      fVar173 = stack[(long)p_Var56].tlower.field_0.v[0];
      fVar288 = stack[(long)p_Var56].tlower.field_0.v[1];
      fVar295 = stack[(long)p_Var56].tlower.field_0.v[2];
      fVar297 = stack[(long)p_Var56].tlower.field_0.v[3];
      args.valid._0_4_ =
           -(uint)(fVar234 + fVar173 <= fVar161) & stack[(long)p_Var56].valid.field_0.i[0];
      args.valid._4_4_ =
           -(uint)(fVar234 + fVar288 <= fVar161) & stack[(long)p_Var56].valid.field_0.i[1];
      args.geometryUserPtr._0_4_ =
           -(uint)(fVar234 + fVar295 <= fVar161) & stack[(long)p_Var56].valid.field_0.i[2];
      args.geometryUserPtr._4_4_ =
           -(uint)(fVar234 + fVar297 <= fVar161) & stack[(long)p_Var56].valid.field_0.i[3];
      uVar65 = movmskps((int)p_Var57,(undefined1  [16])args._0_16_);
      p_Var57 = (RTCFilterFunctionN)(ulong)uVar65;
    } while (uVar65 == 0);
    auVar156._0_4_ = (uint)fVar173 & (uint)args.valid;
    auVar156._4_4_ = (uint)fVar288 & args.valid._4_4_;
    auVar156._8_4_ = (uint)fVar295 & (uint)args.geometryUserPtr;
    auVar156._12_4_ = (uint)fVar297 & args.geometryUserPtr._4_4_;
    auVar172._0_8_ = CONCAT44(~args.valid._4_4_,~(uint)args.valid) & 0x7f8000007f800000;
    auVar172._8_4_ = ~(uint)args.geometryUserPtr & 0x7f800000;
    auVar172._12_4_ = ~args.geometryUserPtr._4_4_ & 0x7f800000;
    auVar172 = auVar172 | auVar156;
    auVar157._4_4_ = auVar172._0_4_;
    auVar157._0_4_ = auVar172._4_4_;
    auVar157._8_4_ = auVar172._12_4_;
    auVar157._12_4_ = auVar172._8_4_;
    auVar77 = minps(auVar157,auVar172);
    auVar141._0_8_ = auVar77._8_8_;
    auVar141._8_4_ = auVar77._0_4_;
    auVar141._12_4_ = auVar77._4_4_;
    auVar77 = minps(auVar141,auVar77);
    auVar142._0_8_ =
         CONCAT44(-(uint)(auVar77._4_4_ == auVar172._4_4_) & args.valid._4_4_,
                  -(uint)(auVar77._0_4_ == auVar172._0_4_) & (uint)args.valid);
    auVar142._8_4_ = -(uint)(auVar77._8_4_ == auVar172._8_4_) & (uint)args.geometryUserPtr;
    auVar142._12_4_ = -(uint)(auVar77._12_4_ == auVar172._12_4_) & args.geometryUserPtr._4_4_;
    iVar55 = movmskps(iVar50 - 1U,auVar142);
    auVar111 = (undefined1  [16])args._0_16_;
    if (iVar55 != 0) {
      auVar111._8_4_ = auVar142._8_4_;
      auVar111._0_8_ = auVar142._0_8_;
      auVar111._12_4_ = auVar142._12_4_;
    }
    pSVar53 = stack + (long)p_Var56;
    uVar65 = movmskps(iVar55,auVar111);
    lVar61 = 0;
    if (uVar65 != 0) {
      for (; (uVar65 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
      }
    }
    *(undefined4 *)((long)&args.valid + lVar61 * 4) = 0;
    uVar7 = stack[(long)p_Var56].u0;
    uVar8 = stack[(long)p_Var56].u1;
    local_614 = stack[(long)p_Var56].depth;
    iVar55 = movmskps(local_614,(undefined1  [16])args._0_16_);
    p_Var57 = (RTCFilterFunctionN)(ulong)(iVar50 - 1);
    if (iVar55 != 0) {
      p_Var57 = p_Var58;
    }
    (pSVar53->valid).field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)args._0_16_;
    fVar161 = (float)uVar8 - (float)uVar7;
    vu0.field_0.v[1] = fVar161 * 0.33333334 + (float)uVar7;
    vu0.field_0.v[0] = fVar161 * 0.0 + (float)uVar7;
    vu0.field_0.v[2] = fVar161 * 0.6666667 + (float)uVar7;
    vu0.field_0.v[3] = fVar161 * 1.0 + (float)uVar7;
    fVar161 = vu0.field_0.v[lVar61];
    fVar173 = *(float *)((long)&vu0.field_0 + lVar61 * 4 + 4);
    p_Var56 = p_Var57;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }